

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx512::CurveNvIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  long lVar70;
  long lVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  uint uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  byte bVar86;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  long lVar87;
  uint uVar88;
  ulong uVar89;
  bool bVar90;
  float fVar91;
  float fVar139;
  float fVar141;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar98 [16];
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar145;
  float fVar146;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar147;
  undefined4 uVar148;
  undefined8 uVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  float fVar161;
  float fVar162;
  float fVar167;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar179;
  undefined1 auVar169 [16];
  float fVar168;
  undefined1 auVar170 [16];
  float fVar177;
  float fVar178;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [16];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [8];
  int iStack_778;
  int iStack_774;
  int iStack_770;
  int iStack_76c;
  int iStack_768;
  int iStack_764;
  undefined1 local_750 [16];
  undefined4 local_740;
  undefined4 uStack_73c;
  undefined8 uStack_738;
  ulong local_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  long local_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  int local_43c;
  undefined1 local_430 [16];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  byte local_3f0;
  float local_3e0 [4];
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar8 = prim[1];
  uVar83 = (ulong)(byte)PVar8;
  lVar71 = uVar83 * 0x19;
  fVar168 = *(float *)(prim + lVar71 + 0x12);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar96 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar97 = vsubps_avx(auVar19,*(undefined1 (*) [16])(prim + lVar71 + 6));
  fVar161 = fVar168 * auVar97._0_4_;
  fVar147 = fVar168 * auVar96._0_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar83 * 4 + 6);
  auVar105 = vpmovsxbd_avx2(auVar19);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar83 * 5 + 6);
  auVar103 = vpmovsxbd_avx2(auVar95);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar83 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar94);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar115 = vpmovsxbd_avx2(auVar92);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar114 = vpmovsxbd_avx2(auVar204);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar83 + 6);
  auVar113 = vpmovsxbd_avx2(auVar5);
  auVar113 = vcvtdq2ps_avx(auVar113);
  uVar89 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar106 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar89 + uVar83 + 6);
  auVar111 = vpmovsxbd_avx2(auVar7);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar107 = vcvtdq2ps_avx(auVar111);
  uVar85 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar101 = vpmovsxbd_avx2(auVar93);
  auVar112 = vcvtdq2ps_avx(auVar101);
  auVar195._4_4_ = fVar147;
  auVar195._0_4_ = fVar147;
  auVar195._8_4_ = fVar147;
  auVar195._12_4_ = fVar147;
  auVar195._16_4_ = fVar147;
  auVar195._20_4_ = fVar147;
  auVar195._24_4_ = fVar147;
  auVar195._28_4_ = fVar147;
  auVar198._8_4_ = 1;
  auVar198._0_8_ = 0x100000001;
  auVar198._12_4_ = 1;
  auVar198._16_4_ = 1;
  auVar198._20_4_ = 1;
  auVar198._24_4_ = 1;
  auVar198._28_4_ = 1;
  auVar108 = ZEXT1632(CONCAT412(fVar168 * auVar96._12_4_,
                                CONCAT48(fVar168 * auVar96._8_4_,
                                         CONCAT44(fVar168 * auVar96._4_4_,fVar147))));
  auVar102 = vpermps_avx2(auVar198,auVar108);
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar100 = vpermps_avx512vl(auVar99,auVar108);
  fVar147 = auVar100._0_4_;
  fVar177 = auVar100._4_4_;
  auVar108._4_4_ = fVar177 * auVar104._4_4_;
  auVar108._0_4_ = fVar147 * auVar104._0_4_;
  fVar178 = auVar100._8_4_;
  auVar108._8_4_ = fVar178 * auVar104._8_4_;
  fVar179 = auVar100._12_4_;
  auVar108._12_4_ = fVar179 * auVar104._12_4_;
  fVar162 = auVar100._16_4_;
  auVar108._16_4_ = fVar162 * auVar104._16_4_;
  fVar167 = auVar100._20_4_;
  auVar108._20_4_ = fVar167 * auVar104._20_4_;
  fVar91 = auVar100._24_4_;
  auVar108._24_4_ = fVar91 * auVar104._24_4_;
  auVar108._28_4_ = auVar111._28_4_;
  auVar111._4_4_ = auVar113._4_4_ * fVar177;
  auVar111._0_4_ = auVar113._0_4_ * fVar147;
  auVar111._8_4_ = auVar113._8_4_ * fVar178;
  auVar111._12_4_ = auVar113._12_4_ * fVar179;
  auVar111._16_4_ = auVar113._16_4_ * fVar162;
  auVar111._20_4_ = auVar113._20_4_ * fVar167;
  auVar111._24_4_ = auVar113._24_4_ * fVar91;
  auVar111._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar112._4_4_ * fVar177;
  auVar101._0_4_ = auVar112._0_4_ * fVar147;
  auVar101._8_4_ = auVar112._8_4_ * fVar178;
  auVar101._12_4_ = auVar112._12_4_ * fVar179;
  auVar101._16_4_ = auVar112._16_4_ * fVar162;
  auVar101._20_4_ = auVar112._20_4_ * fVar167;
  auVar101._24_4_ = auVar112._24_4_ * fVar91;
  auVar101._28_4_ = auVar100._28_4_;
  auVar19 = vfmadd231ps_fma(auVar108,auVar102,auVar103);
  auVar95 = vfmadd231ps_fma(auVar111,auVar102,auVar114);
  auVar94 = vfmadd231ps_fma(auVar101,auVar107,auVar102);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar195,auVar105);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar195,auVar115);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,auVar195);
  auVar196._4_4_ = fVar161;
  auVar196._0_4_ = fVar161;
  auVar196._8_4_ = fVar161;
  auVar196._12_4_ = fVar161;
  auVar196._16_4_ = fVar161;
  auVar196._20_4_ = fVar161;
  auVar196._24_4_ = fVar161;
  auVar196._28_4_ = fVar161;
  auVar101 = ZEXT1632(CONCAT412(fVar168 * auVar97._12_4_,
                                CONCAT48(fVar168 * auVar97._8_4_,
                                         CONCAT44(fVar168 * auVar97._4_4_,fVar161))));
  auVar111 = vpermps_avx2(auVar198,auVar101);
  auVar101 = vpermps_avx512vl(auVar99,auVar101);
  auVar102 = vmulps_avx512vl(auVar101,auVar104);
  auVar110._0_4_ = auVar101._0_4_ * auVar113._0_4_;
  auVar110._4_4_ = auVar101._4_4_ * auVar113._4_4_;
  auVar110._8_4_ = auVar101._8_4_ * auVar113._8_4_;
  auVar110._12_4_ = auVar101._12_4_ * auVar113._12_4_;
  auVar110._16_4_ = auVar101._16_4_ * auVar113._16_4_;
  auVar110._20_4_ = auVar101._20_4_ * auVar113._20_4_;
  auVar110._24_4_ = auVar101._24_4_ * auVar113._24_4_;
  auVar110._28_4_ = 0;
  auVar113._4_4_ = auVar101._4_4_ * auVar112._4_4_;
  auVar113._0_4_ = auVar101._0_4_ * auVar112._0_4_;
  auVar113._8_4_ = auVar101._8_4_ * auVar112._8_4_;
  auVar113._12_4_ = auVar101._12_4_ * auVar112._12_4_;
  auVar113._16_4_ = auVar101._16_4_ * auVar112._16_4_;
  auVar113._20_4_ = auVar101._20_4_ * auVar112._20_4_;
  auVar113._24_4_ = auVar101._24_4_ * auVar112._24_4_;
  auVar113._28_4_ = auVar104._28_4_;
  auVar103 = vfmadd231ps_avx512vl(auVar102,auVar111,auVar103);
  auVar92 = vfmadd231ps_fma(auVar110,auVar111,auVar114);
  auVar204 = vfmadd231ps_fma(auVar113,auVar111,auVar107);
  auVar103 = vfmadd231ps_avx512vl(auVar103,auVar196,auVar105);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar196,auVar115);
  auVar204 = vfmadd231ps_fma(ZEXT1632(auVar204),auVar196,auVar106);
  auVar188._8_4_ = 0x7fffffff;
  auVar188._0_8_ = 0x7fffffff7fffffff;
  auVar188._12_4_ = 0x7fffffff;
  auVar188._16_4_ = 0x7fffffff;
  auVar188._20_4_ = 0x7fffffff;
  auVar188._24_4_ = 0x7fffffff;
  auVar188._28_4_ = 0x7fffffff;
  auVar105 = vandps_avx(ZEXT1632(auVar19),auVar188);
  auVar128._8_4_ = 0x219392ef;
  auVar128._0_8_ = 0x219392ef219392ef;
  auVar128._12_4_ = 0x219392ef;
  auVar128._16_4_ = 0x219392ef;
  auVar128._20_4_ = 0x219392ef;
  auVar128._24_4_ = 0x219392ef;
  auVar128._28_4_ = 0x219392ef;
  uVar89 = vcmpps_avx512vl(auVar105,auVar128,1);
  bVar90 = (bool)((byte)uVar89 & 1);
  auVar102._0_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar19._0_4_;
  bVar90 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar19._4_4_;
  bVar90 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar19._8_4_;
  bVar90 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar19._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar95),auVar188);
  uVar89 = vcmpps_avx512vl(auVar105,auVar128,1);
  bVar90 = (bool)((byte)uVar89 & 1);
  auVar99._0_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar95._0_4_;
  bVar90 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar95._4_4_;
  bVar90 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar95._8_4_;
  bVar90 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar95._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar94),auVar188);
  uVar89 = vcmpps_avx512vl(auVar105,auVar128,1);
  bVar90 = (bool)((byte)uVar89 & 1);
  auVar105._0_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._0_4_;
  bVar90 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._4_4_;
  bVar90 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._8_4_;
  bVar90 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar104 = vrcp14ps_avx512vl(auVar102);
  auVar186._8_4_ = 0x3f800000;
  auVar186._0_8_ = &DAT_3f8000003f800000;
  auVar186._12_4_ = 0x3f800000;
  auVar186._16_4_ = 0x3f800000;
  auVar186._20_4_ = 0x3f800000;
  auVar186._24_4_ = 0x3f800000;
  auVar186._28_4_ = 0x3f800000;
  auVar19 = vfnmadd213ps_fma(auVar102,auVar104,auVar186);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar99);
  auVar95 = vfnmadd213ps_fma(auVar99,auVar104,auVar186);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar105);
  auVar94 = vfnmadd213ps_fma(auVar105,auVar104,auVar186);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar104,auVar104);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 7 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar104 = vsubps_avx512vl(auVar105,auVar103);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 9 + 6));
  auVar106._4_4_ = auVar19._4_4_ * auVar104._4_4_;
  auVar106._0_4_ = auVar19._0_4_ * auVar104._0_4_;
  auVar106._8_4_ = auVar19._8_4_ * auVar104._8_4_;
  auVar106._12_4_ = auVar19._12_4_ * auVar104._12_4_;
  auVar106._16_4_ = auVar104._16_4_ * 0.0;
  auVar106._20_4_ = auVar104._20_4_ * 0.0;
  auVar106._24_4_ = auVar104._24_4_ * 0.0;
  auVar106._28_4_ = auVar104._28_4_;
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx512vl(auVar105,auVar103);
  auVar127._0_4_ = auVar19._0_4_ * auVar105._0_4_;
  auVar127._4_4_ = auVar19._4_4_ * auVar105._4_4_;
  auVar127._8_4_ = auVar19._8_4_ * auVar105._8_4_;
  auVar127._12_4_ = auVar19._12_4_ * auVar105._12_4_;
  auVar127._16_4_ = auVar105._16_4_ * 0.0;
  auVar127._20_4_ = auVar105._20_4_ * 0.0;
  auVar127._24_4_ = auVar105._24_4_ * 0.0;
  auVar127._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar8 * 0x10 + uVar83 * -2 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar92));
  auVar107._4_4_ = auVar95._4_4_ * auVar105._4_4_;
  auVar107._0_4_ = auVar95._0_4_ * auVar105._0_4_;
  auVar107._8_4_ = auVar95._8_4_ * auVar105._8_4_;
  auVar107._12_4_ = auVar95._12_4_ * auVar105._12_4_;
  auVar107._16_4_ = auVar105._16_4_ * 0.0;
  auVar107._20_4_ = auVar105._20_4_ * 0.0;
  auVar107._24_4_ = auVar105._24_4_ * 0.0;
  auVar107._28_4_ = auVar105._28_4_;
  auVar105 = vcvtdq2ps_avx(auVar103);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar92));
  auVar109._0_4_ = auVar95._0_4_ * auVar105._0_4_;
  auVar109._4_4_ = auVar95._4_4_ * auVar105._4_4_;
  auVar109._8_4_ = auVar95._8_4_ * auVar105._8_4_;
  auVar109._12_4_ = auVar95._12_4_ * auVar105._12_4_;
  auVar109._16_4_ = auVar105._16_4_ * 0.0;
  auVar109._20_4_ = auVar105._20_4_ * 0.0;
  auVar109._24_4_ = auVar105._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 + uVar83 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar204));
  auVar112._4_4_ = auVar105._4_4_ * auVar94._4_4_;
  auVar112._0_4_ = auVar105._0_4_ * auVar94._0_4_;
  auVar112._8_4_ = auVar105._8_4_ * auVar94._8_4_;
  auVar112._12_4_ = auVar105._12_4_ * auVar94._12_4_;
  auVar112._16_4_ = auVar105._16_4_ * 0.0;
  auVar112._20_4_ = auVar105._20_4_ * 0.0;
  auVar112._24_4_ = auVar105._24_4_ * 0.0;
  auVar112._28_4_ = auVar105._28_4_;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x17 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar204));
  auVar100._0_4_ = auVar94._0_4_ * auVar105._0_4_;
  auVar100._4_4_ = auVar94._4_4_ * auVar105._4_4_;
  auVar100._8_4_ = auVar94._8_4_ * auVar105._8_4_;
  auVar100._12_4_ = auVar94._12_4_ * auVar105._12_4_;
  auVar100._16_4_ = auVar105._16_4_ * 0.0;
  auVar100._20_4_ = auVar105._20_4_ * 0.0;
  auVar100._24_4_ = auVar105._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar105 = vpminsd_avx2(auVar106,auVar127);
  auVar103 = vpminsd_avx2(auVar107,auVar109);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103 = vpminsd_avx2(auVar112,auVar100);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar104._4_4_ = uVar148;
  auVar104._0_4_ = uVar148;
  auVar104._8_4_ = uVar148;
  auVar104._12_4_ = uVar148;
  auVar104._16_4_ = uVar148;
  auVar104._20_4_ = uVar148;
  auVar104._24_4_ = uVar148;
  auVar104._28_4_ = uVar148;
  auVar103 = vmaxps_avx512vl(auVar103,auVar104);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  auVar103._16_4_ = 0x3f7ffffa;
  auVar103._20_4_ = 0x3f7ffffa;
  auVar103._24_4_ = 0x3f7ffffa;
  auVar103._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar105,auVar103);
  auVar187 = ZEXT3264(local_80);
  auVar105 = vpmaxsd_avx2(auVar106,auVar127);
  auVar160 = ZEXT3264(auVar105);
  auVar103 = vpmaxsd_avx2(auVar107,auVar109);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar103 = vpmaxsd_avx2(auVar112,auVar100);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar115._4_4_ = uVar148;
  auVar115._0_4_ = uVar148;
  auVar115._8_4_ = uVar148;
  auVar115._12_4_ = uVar148;
  auVar115._16_4_ = uVar148;
  auVar115._20_4_ = uVar148;
  auVar115._24_4_ = uVar148;
  auVar115._28_4_ = uVar148;
  auVar103 = vminps_avx512vl(auVar103,auVar115);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar114._8_4_ = 0x3f800003;
  auVar114._0_8_ = 0x3f8000033f800003;
  auVar114._12_4_ = 0x3f800003;
  auVar114._16_4_ = 0x3f800003;
  auVar114._20_4_ = 0x3f800003;
  auVar114._24_4_ = 0x3f800003;
  auVar114._28_4_ = 0x3f800003;
  auVar105 = vmulps_avx512vl(auVar105,auVar114);
  auVar103 = vpbroadcastd_avx512vl();
  uVar20 = vpcmpgtd_avx512vl(auVar103,_DAT_0205a920);
  uVar149 = vcmpps_avx512vl(local_80,auVar105,2);
  bVar90 = (byte)((byte)uVar149 & (byte)uVar20) != 0;
  if (bVar90) {
    uVar89 = (ulong)(byte)((byte)uVar149 & (byte)uVar20);
    local_2e0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar103 = auVar187._0_32_;
      auVar105 = auVar160._0_32_;
      local_620 = in_ZMM21._0_32_;
      local_600 = in_ZMM20._0_32_;
      lVar87 = 0;
      for (uVar83 = uVar89; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        lVar87 = lVar87 + 1;
      }
      uVar89 = uVar89 - 1 & uVar89;
      uVar83 = (ulong)(uint)((int)lVar87 << 6);
      uVar88 = *(uint *)(prim + 2);
      pGVar10 = (context->scene->geometries).items[uVar88].ptr;
      auVar19 = *(undefined1 (*) [16])(prim + uVar83 + lVar71 + 0x16);
      if (uVar89 != 0) {
        uVar84 = uVar89 - 1 & uVar89;
        for (uVar85 = uVar89; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
        }
        if (uVar84 != 0) {
          for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_550 = *(undefined1 (*) [16])(prim + uVar83 + lVar71 + 0x26);
      local_560 = *(undefined1 (*) [16])(prim + uVar83 + lVar71 + 0x36);
      local_570 = *(undefined1 (*) [16])(prim + uVar83 + lVar71 + 0x46);
      local_640._0_8_ = pGVar10;
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar92 = vsubps_avx512vl(auVar19,auVar95);
      uVar148 = auVar92._0_4_;
      auVar96._4_4_ = uVar148;
      auVar96._0_4_ = uVar148;
      auVar96._8_4_ = uVar148;
      auVar96._12_4_ = uVar148;
      auVar94 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar168 = pre->ray_space[k].vz.field_0.m128[0];
      fVar147 = pre->ray_space[k].vz.field_0.m128[1];
      fVar177 = pre->ray_space[k].vz.field_0.m128[2];
      fVar178 = pre->ray_space[k].vz.field_0.m128[3];
      auVar98._0_4_ = fVar168 * auVar92._0_4_;
      auVar98._4_4_ = fVar147 * auVar92._4_4_;
      auVar98._8_4_ = fVar177 * auVar92._8_4_;
      auVar98._12_4_ = fVar178 * auVar92._12_4_;
      auVar94 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar94);
      auVar204 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar96);
      auVar93 = vshufps_avx512vl(auVar19,auVar19,0xff);
      auVar92 = vsubps_avx(local_550,auVar95);
      uVar148 = auVar92._0_4_;
      auVar163._4_4_ = uVar148;
      auVar163._0_4_ = uVar148;
      auVar163._8_4_ = uVar148;
      auVar163._12_4_ = uVar148;
      auVar94 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar190._0_4_ = fVar168 * auVar92._0_4_;
      auVar190._4_4_ = fVar147 * auVar92._4_4_;
      auVar190._8_4_ = fVar177 * auVar92._8_4_;
      auVar190._12_4_ = fVar178 * auVar92._12_4_;
      auVar94 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar4,auVar94);
      auVar5 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar163);
      auVar92 = vsubps_avx512vl(local_560,auVar95);
      uVar148 = auVar92._0_4_;
      auVar164._4_4_ = uVar148;
      auVar164._0_4_ = uVar148;
      auVar164._8_4_ = uVar148;
      auVar164._12_4_ = uVar148;
      auVar94 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar192._0_4_ = fVar168 * auVar92._0_4_;
      auVar192._4_4_ = fVar147 * auVar92._4_4_;
      auVar192._8_4_ = fVar177 * auVar92._8_4_;
      auVar192._12_4_ = fVar178 * auVar92._12_4_;
      auVar94 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar4,auVar94);
      auVar92 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar164);
      auVar94 = vsubps_avx512vl(local_570,auVar95);
      uVar148 = auVar94._0_4_;
      auVar97._4_4_ = uVar148;
      auVar97._0_4_ = uVar148;
      auVar97._8_4_ = uVar148;
      auVar97._12_4_ = uVar148;
      auVar95 = vshufps_avx(auVar94,auVar94,0x55);
      auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar193._0_4_ = fVar168 * auVar94._0_4_;
      auVar193._4_4_ = fVar147 * auVar94._4_4_;
      auVar193._8_4_ = fVar177 * auVar94._8_4_;
      auVar193._12_4_ = fVar178 * auVar94._12_4_;
      auVar95 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar4,auVar95);
      auVar6 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar3,auVar97);
      lVar70 = (long)iVar9 * 0x44;
      auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar70);
      uVar148 = auVar204._0_4_;
      local_5a0._4_4_ = uVar148;
      local_5a0._0_4_ = uVar148;
      local_5a0._8_4_ = uVar148;
      local_5a0._12_4_ = uVar148;
      local_5a0._16_4_ = uVar148;
      local_5a0._20_4_ = uVar148;
      local_5a0._24_4_ = uVar148;
      local_5a0._28_4_ = uVar148;
      auVar159._8_4_ = 1;
      auVar159._0_8_ = 0x100000001;
      auVar159._12_4_ = 1;
      auVar159._16_4_ = 1;
      auVar159._20_4_ = 1;
      auVar159._24_4_ = 1;
      auVar159._28_4_ = 1;
      local_5c0 = vpermps_avx512vl(auVar159,ZEXT1632(auVar204));
      auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0x484);
      local_700 = vbroadcastss_avx512vl(auVar5);
      local_320 = vpermps_avx2(auVar159,ZEXT1632(auVar5));
      auVar114 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0x908);
      local_a0 = vbroadcastss_avx512vl(auVar92);
      local_c0 = vpermps_avx512vl(auVar159,ZEXT1632(auVar92));
      auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0xd8c);
      local_660 = vbroadcastss_avx512vl(auVar6);
      auVar206 = ZEXT3264(local_660);
      local_680 = vpermps_avx512vl(auVar159,ZEXT1632(auVar6));
      auVar106 = vmulps_avx512vl(local_660,auVar113);
      auVar107 = vmulps_avx512vl(local_680,auVar113);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,local_a0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_c0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,local_700);
      auVar95 = vfmadd231ps_fma(auVar107,auVar115,local_320);
      auVar101 = vfmadd231ps_avx512vl(auVar106,auVar104,local_5a0);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar104,local_5c0);
      auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar70);
      auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0x484);
      auVar112 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0x908);
      auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0xd8c);
      auVar108 = vmulps_avx512vl(local_660,auVar111);
      auVar99 = vmulps_avx512vl(local_680,auVar111);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,local_a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,local_c0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar107,local_700);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_320);
      auVar7 = vfmadd231ps_fma(auVar108,auVar106,local_5a0);
      auVar108 = vfmadd231ps_avx512vl(auVar99,auVar106,local_5c0);
      local_720 = vsubps_avx512vl(ZEXT1632(auVar7),auVar101);
      _local_780 = vsubps_avx(auVar108,auVar102);
      auVar99 = vmulps_avx512vl(auVar102,local_720);
      auVar100 = vmulps_avx512vl(auVar101,_local_780);
      auVar99 = vsubps_avx512vl(auVar99,auVar100);
      auVar95 = vshufps_avx(local_550,local_550,0xff);
      uVar149 = auVar93._0_8_;
      local_e0._8_8_ = uVar149;
      local_e0._0_8_ = uVar149;
      local_e0._16_8_ = uVar149;
      local_e0._24_8_ = uVar149;
      local_100 = vbroadcastsd_avx512vl(auVar95);
      auVar95 = vshufps_avx512vl(local_560,local_560,0xff);
      local_120 = vbroadcastsd_avx512vl(auVar95);
      auVar95 = vshufps_avx512vl(local_570,local_570,0xff);
      uVar149 = auVar95._0_8_;
      register0x00001248 = uVar149;
      local_140 = uVar149;
      register0x00001250 = uVar149;
      register0x00001258 = uVar149;
      auVar100 = vmulps_avx512vl(_local_140,auVar113);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar114,local_120);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar115,local_100);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,local_e0);
      auVar109 = vmulps_avx512vl(_local_140,auVar111);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,local_120);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar107,local_100);
      auVar93 = vfmadd231ps_fma(auVar109,auVar106,local_e0);
      auVar109 = vmulps_avx512vl(_local_780,_local_780);
      auVar109 = vfmadd231ps_avx512vl(auVar109,local_720,local_720);
      auVar110 = vmaxps_avx512vl(auVar100,ZEXT1632(auVar93));
      auVar110 = vmulps_avx512vl(auVar110,auVar110);
      auVar109 = vmulps_avx512vl(auVar110,auVar109);
      auVar99 = vmulps_avx512vl(auVar99,auVar99);
      uVar149 = vcmpps_avx512vl(auVar99,auVar109,2);
      auVar95 = vblendps_avx(auVar204,auVar19,8);
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar94 = vandps_avx512vl(auVar95,auVar96);
      auVar95 = vblendps_avx(auVar5,local_550,8);
      auVar95 = vandps_avx512vl(auVar95,auVar96);
      auVar94 = vmaxps_avx(auVar94,auVar95);
      auVar95 = vblendps_avx(auVar92,local_560,8);
      auVar97 = vandps_avx512vl(auVar95,auVar96);
      auVar95 = vblendps_avx(auVar6,local_570,8);
      auVar95 = vandps_avx512vl(auVar95,auVar96);
      auVar95 = vmaxps_avx(auVar97,auVar95);
      auVar95 = vmaxps_avx(auVar94,auVar95);
      auVar94 = vmovshdup_avx(auVar95);
      auVar94 = vmaxss_avx(auVar94,auVar95);
      auVar95 = vshufpd_avx(auVar95,auVar95,1);
      auVar95 = vmaxss_avx(auVar95,auVar94);
      auVar94 = vcvtsi2ss_avx512f(local_570,iVar9);
      local_4c0._0_16_ = auVar94;
      auVar194._0_4_ = auVar94._0_4_;
      auVar194._4_4_ = auVar194._0_4_;
      auVar194._8_4_ = auVar194._0_4_;
      auVar194._12_4_ = auVar194._0_4_;
      auVar194._16_4_ = auVar194._0_4_;
      auVar194._20_4_ = auVar194._0_4_;
      auVar194._24_4_ = auVar194._0_4_;
      auVar194._28_4_ = auVar194._0_4_;
      uVar20 = vcmpps_avx512vl(auVar194,_DAT_02020f40,0xe);
      local_3f0 = (byte)uVar149 & (byte)uVar20;
      local_6a0 = auVar95._0_4_ * 4.7683716e-07;
      auVar165._8_4_ = 2;
      auVar165._0_8_ = 0x200000002;
      auVar165._12_4_ = 2;
      auVar165._16_4_ = 2;
      auVar165._20_4_ = 2;
      auVar165._24_4_ = 2;
      auVar165._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar165,ZEXT1632(auVar204));
      local_180 = vpermps_avx512vl(auVar165,ZEXT1632(auVar5));
      local_1a0 = vpermps_avx512vl(auVar165,ZEXT1632(auVar92));
      local_5e0 = vpermps_avx2(auVar165,ZEXT1632(auVar6));
      fVar168 = *(float *)(ray + k * 4 + 0x60);
      local_750 = ZEXT416((uint)local_6a0);
      if (local_3f0 == 0) {
        uVar83 = 0;
        auVar95 = vxorps_avx512vl(auVar19,auVar19);
        auVar205 = ZEXT1664(auVar95);
        auVar187 = ZEXT3264(auVar103);
        in_ZMM20 = ZEXT3264(local_600);
        auVar160 = ZEXT3264(auVar105);
        in_ZMM21 = ZEXT3264(local_620);
        auVar203 = ZEXT3264(local_5a0);
        auVar202 = ZEXT3264(local_5c0);
        auVar201 = ZEXT3264(local_700);
        auVar207 = ZEXT3264(local_680);
      }
      else {
        fStack_69c = 0.0;
        fStack_698 = 0.0;
        fStack_694 = 0.0;
        auVar111 = vmulps_avx512vl(local_5e0,auVar111);
        auVar112 = vfmadd213ps_avx512vl(auVar112,local_1a0,auVar111);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar112);
        auVar107 = vfmadd213ps_avx512vl(auVar106,local_160,auVar107);
        auVar113 = vmulps_avx512vl(local_5e0,auVar113);
        auVar114 = vfmadd213ps_avx512vl(auVar114,local_1a0,auVar113);
        auVar112 = vfmadd213ps_avx512vl(auVar115,local_180,auVar114);
        auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0x1694);
        auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0x1b18);
        auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0x1f9c);
        auVar112 = vfmadd213ps_avx512vl(auVar104,local_160,auVar112);
        auVar104 = vmulps_avx512vl(local_660,auVar106);
        auVar111 = vmulps_avx512vl(local_680,auVar106);
        auVar32._4_4_ = local_5e0._4_4_ * auVar106._4_4_;
        auVar32._0_4_ = local_5e0._0_4_ * auVar106._0_4_;
        auVar32._8_4_ = local_5e0._8_4_ * auVar106._8_4_;
        auVar32._12_4_ = local_5e0._12_4_ * auVar106._12_4_;
        auVar32._16_4_ = local_5e0._16_4_ * auVar106._16_4_;
        auVar32._20_4_ = local_5e0._20_4_ * auVar106._20_4_;
        auVar32._24_4_ = local_5e0._24_4_ * auVar106._24_4_;
        auVar32._28_4_ = auVar106._28_4_;
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,local_a0);
        auVar106 = vfmadd231ps_avx512vl(auVar111,auVar113,local_c0);
        auVar113 = vfmadd231ps_avx512vl(auVar32,local_1a0,auVar113);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar114,local_700);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,local_320);
        auVar111 = vfmadd231ps_avx512vl(auVar113,local_180,auVar114);
        auVar99 = vfmadd231ps_avx512vl(auVar104,auVar115,local_5a0);
        auVar202 = ZEXT3264(local_5c0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,local_5c0);
        auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0x1b18);
        auVar113 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0x1f9c);
        auVar111 = vfmadd231ps_avx512vl(auVar111,local_160,auVar115);
        auVar115 = vmulps_avx512vl(local_660,auVar113);
        auVar109 = vmulps_avx512vl(local_680,auVar113);
        auVar33._4_4_ = local_5e0._4_4_ * auVar113._4_4_;
        auVar33._0_4_ = local_5e0._0_4_ * auVar113._0_4_;
        auVar33._8_4_ = local_5e0._8_4_ * auVar113._8_4_;
        auVar33._12_4_ = local_5e0._12_4_ * auVar113._12_4_;
        auVar33._16_4_ = local_5e0._16_4_ * auVar113._16_4_;
        auVar33._20_4_ = local_5e0._20_4_ * auVar113._20_4_;
        auVar33._24_4_ = local_5e0._24_4_ * auVar113._24_4_;
        auVar33._28_4_ = auVar113._28_4_;
        auVar113 = vfmadd231ps_avx512vl(auVar115,auVar114,local_a0);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar114,local_c0);
        auVar114 = vfmadd231ps_avx512vl(auVar33,local_1a0,auVar114);
        auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0x1694);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,local_700);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar115,local_320);
        auVar115 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
        auVar114 = vfmadd231ps_avx512vl(auVar113,auVar104,local_5a0);
        auVar113 = vfmadd231ps_avx512vl(auVar109,auVar104,local_5c0);
        auVar109 = vfmadd231ps_avx512vl(auVar115,local_160,auVar104);
        auVar199._8_4_ = 0x7fffffff;
        auVar199._0_8_ = 0x7fffffff7fffffff;
        auVar199._12_4_ = 0x7fffffff;
        auVar199._16_4_ = 0x7fffffff;
        auVar199._20_4_ = 0x7fffffff;
        auVar199._24_4_ = 0x7fffffff;
        auVar199._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(auVar99,auVar199);
        auVar115 = vandps_avx(auVar106,auVar199);
        auVar115 = vmaxps_avx(auVar104,auVar115);
        auVar104 = vandps_avx(auVar111,auVar199);
        auVar104 = vmaxps_avx(auVar115,auVar104);
        auVar111 = vbroadcastss_avx512vl(local_750);
        uVar83 = vcmpps_avx512vl(auVar104,auVar111,1);
        bVar12 = (bool)((byte)uVar83 & 1);
        auVar116._0_4_ = (float)((uint)bVar12 * local_720._0_4_ | (uint)!bVar12 * auVar99._0_4_);
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar12 * local_720._4_4_ | (uint)!bVar12 * auVar99._4_4_);
        bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar12 * local_720._8_4_ | (uint)!bVar12 * auVar99._8_4_);
        bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar12 * local_720._12_4_ | (uint)!bVar12 * auVar99._12_4_);
        bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar12 * local_720._16_4_ | (uint)!bVar12 * auVar99._16_4_);
        bVar12 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar12 * local_720._20_4_ | (uint)!bVar12 * auVar99._20_4_);
        bVar12 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar12 * local_720._24_4_ | (uint)!bVar12 * auVar99._24_4_);
        bVar12 = SUB81(uVar83 >> 7,0);
        auVar116._28_4_ = (uint)bVar12 * local_720._28_4_ | (uint)!bVar12 * auVar99._28_4_;
        bVar12 = (bool)((byte)uVar83 & 1);
        auVar117._0_4_ = (float)((uint)bVar12 * local_780._0_4_ | (uint)!bVar12 * auVar106._0_4_);
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar12 * local_780._4_4_ | (uint)!bVar12 * auVar106._4_4_);
        bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar12 * iStack_778 | (uint)!bVar12 * auVar106._8_4_);
        bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar12 * iStack_774 | (uint)!bVar12 * auVar106._12_4_);
        bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar12 * iStack_770 | (uint)!bVar12 * auVar106._16_4_);
        bVar12 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar12 * iStack_76c | (uint)!bVar12 * auVar106._20_4_);
        bVar12 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar12 * iStack_768 | (uint)!bVar12 * auVar106._24_4_);
        bVar12 = SUB81(uVar83 >> 7,0);
        auVar117._28_4_ = (uint)bVar12 * iStack_764 | (uint)!bVar12 * auVar106._28_4_;
        auVar104 = vandps_avx(auVar199,auVar114);
        auVar115 = vandps_avx(auVar113,auVar199);
        auVar115 = vmaxps_avx(auVar104,auVar115);
        auVar104 = vandps_avx(auVar109,auVar199);
        auVar104 = vmaxps_avx(auVar115,auVar104);
        uVar83 = vcmpps_avx512vl(auVar104,auVar111,1);
        bVar12 = (bool)((byte)uVar83 & 1);
        auVar118._0_4_ = (float)((uint)bVar12 * local_720._0_4_ | (uint)!bVar12 * auVar114._0_4_);
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar12 * local_720._4_4_ | (uint)!bVar12 * auVar114._4_4_);
        bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar12 * local_720._8_4_ | (uint)!bVar12 * auVar114._8_4_);
        bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar12 * local_720._12_4_ | (uint)!bVar12 * auVar114._12_4_)
        ;
        bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar12 * local_720._16_4_ | (uint)!bVar12 * auVar114._16_4_)
        ;
        bVar12 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar12 * local_720._20_4_ | (uint)!bVar12 * auVar114._20_4_)
        ;
        bVar12 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar12 * local_720._24_4_ | (uint)!bVar12 * auVar114._24_4_)
        ;
        bVar12 = SUB81(uVar83 >> 7,0);
        auVar118._28_4_ = (uint)bVar12 * local_720._28_4_ | (uint)!bVar12 * auVar114._28_4_;
        bVar12 = (bool)((byte)uVar83 & 1);
        auVar119._0_4_ = (float)((uint)bVar12 * local_780._0_4_ | (uint)!bVar12 * auVar113._0_4_);
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar12 * local_780._4_4_ | (uint)!bVar12 * auVar113._4_4_);
        bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar12 * iStack_778 | (uint)!bVar12 * auVar113._8_4_);
        bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar12 * iStack_774 | (uint)!bVar12 * auVar113._12_4_);
        bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar12 * iStack_770 | (uint)!bVar12 * auVar113._16_4_);
        bVar12 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar12 * iStack_76c | (uint)!bVar12 * auVar113._20_4_);
        bVar12 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar12 * iStack_768 | (uint)!bVar12 * auVar113._24_4_);
        bVar12 = SUB81(uVar83 >> 7,0);
        auVar119._28_4_ = (uint)bVar12 * iStack_764 | (uint)!bVar12 * auVar113._28_4_;
        auVar98 = vxorps_avx512vl(auVar19,auVar19);
        auVar205 = ZEXT1664(auVar98);
        auVar104 = vfmadd213ps_avx512vl(auVar116,auVar116,ZEXT1632(auVar98));
        auVar95 = vfmadd231ps_fma(auVar104,auVar117,auVar117);
        auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar147 = auVar104._0_4_;
        fVar177 = auVar104._4_4_;
        fVar178 = auVar104._8_4_;
        fVar179 = auVar104._12_4_;
        fVar162 = auVar104._16_4_;
        fVar167 = auVar104._20_4_;
        fVar91 = auVar104._24_4_;
        auVar34._4_4_ = fVar177 * fVar177 * fVar177 * auVar95._4_4_ * -0.5;
        auVar34._0_4_ = fVar147 * fVar147 * fVar147 * auVar95._0_4_ * -0.5;
        auVar34._8_4_ = fVar178 * fVar178 * fVar178 * auVar95._8_4_ * -0.5;
        auVar34._12_4_ = fVar179 * fVar179 * fVar179 * auVar95._12_4_ * -0.5;
        auVar34._16_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar34._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar34._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar34._28_4_ = 0;
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar114 = vfmadd231ps_avx512vl(auVar34,auVar115,auVar104);
        auVar35._4_4_ = auVar117._4_4_ * auVar114._4_4_;
        auVar35._0_4_ = auVar117._0_4_ * auVar114._0_4_;
        auVar35._8_4_ = auVar117._8_4_ * auVar114._8_4_;
        auVar35._12_4_ = auVar117._12_4_ * auVar114._12_4_;
        auVar35._16_4_ = auVar117._16_4_ * auVar114._16_4_;
        auVar35._20_4_ = auVar117._20_4_ * auVar114._20_4_;
        auVar35._24_4_ = auVar117._24_4_ * auVar114._24_4_;
        auVar35._28_4_ = auVar104._28_4_;
        auVar36._4_4_ = auVar114._4_4_ * -auVar116._4_4_;
        auVar36._0_4_ = auVar114._0_4_ * -auVar116._0_4_;
        auVar36._8_4_ = auVar114._8_4_ * -auVar116._8_4_;
        auVar36._12_4_ = auVar114._12_4_ * -auVar116._12_4_;
        auVar36._16_4_ = auVar114._16_4_ * -auVar116._16_4_;
        auVar36._20_4_ = auVar114._20_4_ * -auVar116._20_4_;
        auVar36._24_4_ = auVar114._24_4_ * -auVar116._24_4_;
        auVar36._28_4_ = auVar116._28_4_ ^ 0x80000000;
        auVar104 = vmulps_avx512vl(auVar114,ZEXT1632(auVar98));
        auVar99 = ZEXT1632(auVar98);
        auVar113 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar99);
        auVar95 = vfmadd231ps_fma(auVar113,auVar119,auVar119);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar147 = auVar113._0_4_;
        fVar177 = auVar113._4_4_;
        fVar178 = auVar113._8_4_;
        fVar179 = auVar113._12_4_;
        fVar162 = auVar113._16_4_;
        fVar167 = auVar113._20_4_;
        fVar91 = auVar113._24_4_;
        auVar37._4_4_ = fVar177 * fVar177 * fVar177 * auVar95._4_4_ * -0.5;
        auVar37._0_4_ = fVar147 * fVar147 * fVar147 * auVar95._0_4_ * -0.5;
        auVar37._8_4_ = fVar178 * fVar178 * fVar178 * auVar95._8_4_ * -0.5;
        auVar37._12_4_ = fVar179 * fVar179 * fVar179 * auVar95._12_4_ * -0.5;
        auVar37._16_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar37._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar37._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar37._28_4_ = 0;
        auVar115 = vfmadd231ps_avx512vl(auVar37,auVar115,auVar113);
        auVar38._4_4_ = auVar119._4_4_ * auVar115._4_4_;
        auVar38._0_4_ = auVar119._0_4_ * auVar115._0_4_;
        auVar38._8_4_ = auVar119._8_4_ * auVar115._8_4_;
        auVar38._12_4_ = auVar119._12_4_ * auVar115._12_4_;
        auVar38._16_4_ = auVar119._16_4_ * auVar115._16_4_;
        auVar38._20_4_ = auVar119._20_4_ * auVar115._20_4_;
        auVar38._24_4_ = auVar119._24_4_ * auVar115._24_4_;
        auVar38._28_4_ = auVar113._28_4_;
        auVar39._4_4_ = -auVar118._4_4_ * auVar115._4_4_;
        auVar39._0_4_ = -auVar118._0_4_ * auVar115._0_4_;
        auVar39._8_4_ = -auVar118._8_4_ * auVar115._8_4_;
        auVar39._12_4_ = -auVar118._12_4_ * auVar115._12_4_;
        auVar39._16_4_ = -auVar118._16_4_ * auVar115._16_4_;
        auVar39._20_4_ = -auVar118._20_4_ * auVar115._20_4_;
        auVar39._24_4_ = -auVar118._24_4_ * auVar115._24_4_;
        auVar39._28_4_ = auVar114._28_4_;
        auVar115 = vmulps_avx512vl(auVar115,auVar99);
        auVar95 = vfmadd213ps_fma(auVar35,auVar100,auVar101);
        auVar94 = vfmadd213ps_fma(auVar36,auVar100,auVar102);
        auVar114 = vfmadd213ps_avx512vl(auVar104,auVar100,auVar112);
        auVar113 = vfmadd213ps_avx512vl(auVar38,ZEXT1632(auVar93),ZEXT1632(auVar7));
        auVar96 = vfnmadd213ps_fma(auVar35,auVar100,auVar101);
        auVar111 = ZEXT1632(auVar93);
        auVar92 = vfmadd213ps_fma(auVar39,auVar111,auVar108);
        auVar97 = vfnmadd213ps_fma(auVar36,auVar100,auVar102);
        auVar204 = vfmadd213ps_fma(auVar115,auVar111,auVar107);
        auVar106 = vfnmadd231ps_avx512vl(auVar112,auVar100,auVar104);
        auVar7 = vfnmadd213ps_fma(auVar38,auVar111,ZEXT1632(auVar7));
        auVar163 = vfnmadd213ps_fma(auVar39,auVar111,auVar108);
        auVar164 = vfnmadd231ps_fma(auVar107,ZEXT1632(auVar93),auVar115);
        auVar115 = vsubps_avx512vl(auVar113,ZEXT1632(auVar96));
        auVar104 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar97));
        auVar107 = vsubps_avx512vl(ZEXT1632(auVar204),auVar106);
        auVar112 = vmulps_avx512vl(auVar104,auVar106);
        auVar5 = vfmsub231ps_fma(auVar112,ZEXT1632(auVar97),auVar107);
        auVar40._4_4_ = auVar96._4_4_ * auVar107._4_4_;
        auVar40._0_4_ = auVar96._0_4_ * auVar107._0_4_;
        auVar40._8_4_ = auVar96._8_4_ * auVar107._8_4_;
        auVar40._12_4_ = auVar96._12_4_ * auVar107._12_4_;
        auVar40._16_4_ = auVar107._16_4_ * 0.0;
        auVar40._20_4_ = auVar107._20_4_ * 0.0;
        auVar40._24_4_ = auVar107._24_4_ * 0.0;
        auVar40._28_4_ = auVar107._28_4_;
        auVar107 = vfmsub231ps_avx512vl(auVar40,auVar106,auVar115);
        auVar41._4_4_ = auVar97._4_4_ * auVar115._4_4_;
        auVar41._0_4_ = auVar97._0_4_ * auVar115._0_4_;
        auVar41._8_4_ = auVar97._8_4_ * auVar115._8_4_;
        auVar41._12_4_ = auVar97._12_4_ * auVar115._12_4_;
        auVar41._16_4_ = auVar115._16_4_ * 0.0;
        auVar41._20_4_ = auVar115._20_4_ * 0.0;
        auVar41._24_4_ = auVar115._24_4_ * 0.0;
        auVar41._28_4_ = auVar115._28_4_;
        auVar6 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar96),auVar104);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar6),auVar99,auVar107);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar99,ZEXT1632(auVar5));
        auVar99 = ZEXT1632(auVar98);
        uVar83 = vcmpps_avx512vl(auVar104,auVar99,2);
        bVar86 = (byte)uVar83;
        fVar91 = (float)((uint)(bVar86 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar86 & 1) * auVar7._0_4_);
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar139 = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar7._4_4_);
        bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar141 = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar7._8_4_);
        bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar143 = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar7._12_4_);
        auVar112 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar91))));
        fVar161 = (float)((uint)(bVar86 & 1) * auVar94._0_4_ |
                         (uint)!(bool)(bVar86 & 1) * auVar163._0_4_);
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar140 = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar163._4_4_);
        bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar142 = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar163._8_4_);
        bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar144 = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar163._12_4_);
        auVar111 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar142,CONCAT44(fVar140,fVar161))));
        auVar120._0_4_ =
             (float)((uint)(bVar86 & 1) * auVar114._0_4_ |
                    (uint)!(bool)(bVar86 & 1) * auVar164._0_4_);
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar164._4_4_);
        bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar164._8_4_);
        bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar164._12_4_);
        fVar147 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar114._16_4_);
        auVar120._16_4_ = fVar147;
        fVar177 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar114._20_4_);
        auVar120._20_4_ = fVar177;
        fVar178 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar114._24_4_);
        auVar120._24_4_ = fVar178;
        iVar1 = (uint)(byte)(uVar83 >> 7) * auVar114._28_4_;
        auVar120._28_4_ = iVar1;
        auVar115 = vblendmps_avx512vl(ZEXT1632(auVar96),auVar113);
        auVar121._0_4_ =
             (uint)(bVar86 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar5._0_4_;
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * auVar5._4_4_;
        bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * auVar5._8_4_;
        bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * auVar5._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar115._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar115._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar115._24_4_;
        auVar121._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar115._28_4_;
        auVar115 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar92));
        auVar122._0_4_ =
             (float)((uint)(bVar86 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar94._0_4_
                    );
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * auVar94._4_4_);
        bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * auVar94._8_4_);
        bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * auVar94._12_4_);
        fVar179 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar115._16_4_);
        auVar122._16_4_ = fVar179;
        fVar162 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar115._20_4_);
        auVar122._20_4_ = fVar162;
        fVar167 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar115._24_4_);
        auVar122._24_4_ = fVar167;
        auVar122._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar115._28_4_;
        auVar115 = vblendmps_avx512vl(auVar106,ZEXT1632(auVar204));
        auVar123._0_4_ =
             (float)((uint)(bVar86 & 1) * auVar115._0_4_ |
                    (uint)!(bool)(bVar86 & 1) * auVar114._0_4_);
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * auVar114._4_4_);
        bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * auVar114._8_4_);
        bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * auVar114._12_4_);
        bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar12 * auVar115._16_4_ | (uint)!bVar12 * auVar114._16_4_);
        bVar12 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar12 * auVar115._20_4_ | (uint)!bVar12 * auVar114._20_4_);
        bVar12 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar12 * auVar115._24_4_ | (uint)!bVar12 * auVar114._24_4_);
        bVar12 = SUB81(uVar83 >> 7,0);
        auVar123._28_4_ = (uint)bVar12 * auVar115._28_4_ | (uint)!bVar12 * auVar114._28_4_;
        auVar124._0_4_ =
             (uint)(bVar86 & 1) * (int)auVar96._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar113._0_4_;
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar12 * (int)auVar96._4_4_ | (uint)!bVar12 * auVar113._4_4_;
        bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar12 * (int)auVar96._8_4_ | (uint)!bVar12 * auVar113._8_4_;
        bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar12 * (int)auVar96._12_4_ | (uint)!bVar12 * auVar113._12_4_;
        auVar124._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar113._16_4_;
        auVar124._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar113._20_4_;
        auVar124._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar113._24_4_;
        auVar124._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar113._28_4_;
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar125._0_4_ =
             (uint)(bVar86 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar204._0_4_;
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar204._4_4_;
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar204._8_4_;
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar204._12_4_;
        auVar125._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar106._16_4_;
        auVar125._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar106._20_4_;
        auVar125._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar106._24_4_;
        iVar2 = (uint)(byte)(uVar83 >> 7) * auVar106._28_4_;
        auVar125._28_4_ = iVar2;
        auVar101 = vsubps_avx512vl(auVar124,auVar112);
        auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar97._12_4_ |
                                                 (uint)!bVar15 * auVar92._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar97._8_4_ |
                                                          (uint)!bVar14 * auVar92._8_4_,
                                                          CONCAT44((uint)bVar12 * (int)auVar97._4_4_
                                                                   | (uint)!bVar12 * auVar92._4_4_,
                                                                   (uint)(bVar86 & 1) *
                                                                   (int)auVar97._0_4_ |
                                                                   (uint)!(bool)(bVar86 & 1) *
                                                                   auVar92._0_4_)))),auVar111);
        auVar114 = vsubps_avx(auVar125,auVar120);
        auVar113 = vsubps_avx(auVar112,auVar121);
        auVar106 = vsubps_avx(auVar111,auVar122);
        auVar107 = vsubps_avx(auVar120,auVar123);
        auVar42._4_4_ = auVar114._4_4_ * fVar139;
        auVar42._0_4_ = auVar114._0_4_ * fVar91;
        auVar42._8_4_ = auVar114._8_4_ * fVar141;
        auVar42._12_4_ = auVar114._12_4_ * fVar143;
        auVar42._16_4_ = auVar114._16_4_ * 0.0;
        auVar42._20_4_ = auVar114._20_4_ * 0.0;
        auVar42._24_4_ = auVar114._24_4_ * 0.0;
        auVar42._28_4_ = iVar2;
        auVar95 = vfmsub231ps_fma(auVar42,auVar120,auVar101);
        auVar43._4_4_ = fVar140 * auVar101._4_4_;
        auVar43._0_4_ = fVar161 * auVar101._0_4_;
        auVar43._8_4_ = fVar142 * auVar101._8_4_;
        auVar43._12_4_ = fVar144 * auVar101._12_4_;
        auVar43._16_4_ = auVar101._16_4_ * 0.0;
        auVar43._20_4_ = auVar101._20_4_ * 0.0;
        auVar43._24_4_ = auVar101._24_4_ * 0.0;
        auVar43._28_4_ = auVar104._28_4_;
        auVar94 = vfmsub231ps_fma(auVar43,auVar112,auVar115);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar99,ZEXT1632(auVar95));
        auVar171._0_4_ = auVar115._0_4_ * auVar120._0_4_;
        auVar171._4_4_ = auVar115._4_4_ * auVar120._4_4_;
        auVar171._8_4_ = auVar115._8_4_ * auVar120._8_4_;
        auVar171._12_4_ = auVar115._12_4_ * auVar120._12_4_;
        auVar171._16_4_ = auVar115._16_4_ * fVar147;
        auVar171._20_4_ = auVar115._20_4_ * fVar177;
        auVar171._24_4_ = auVar115._24_4_ * fVar178;
        auVar171._28_4_ = 0;
        auVar95 = vfmsub231ps_fma(auVar171,auVar111,auVar114);
        auVar102 = vfmadd231ps_avx512vl(auVar104,auVar99,ZEXT1632(auVar95));
        auVar104 = vmulps_avx512vl(auVar107,auVar121);
        auVar104 = vfmsub231ps_avx512vl(auVar104,auVar113,auVar123);
        auVar44._4_4_ = auVar106._4_4_ * auVar123._4_4_;
        auVar44._0_4_ = auVar106._0_4_ * auVar123._0_4_;
        auVar44._8_4_ = auVar106._8_4_ * auVar123._8_4_;
        auVar44._12_4_ = auVar106._12_4_ * auVar123._12_4_;
        auVar44._16_4_ = auVar106._16_4_ * auVar123._16_4_;
        auVar44._20_4_ = auVar106._20_4_ * auVar123._20_4_;
        auVar44._24_4_ = auVar106._24_4_ * auVar123._24_4_;
        auVar44._28_4_ = auVar123._28_4_;
        auVar95 = vfmsub231ps_fma(auVar44,auVar122,auVar107);
        auVar172._0_4_ = auVar122._0_4_ * auVar113._0_4_;
        auVar172._4_4_ = auVar122._4_4_ * auVar113._4_4_;
        auVar172._8_4_ = auVar122._8_4_ * auVar113._8_4_;
        auVar172._12_4_ = auVar122._12_4_ * auVar113._12_4_;
        auVar172._16_4_ = fVar179 * auVar113._16_4_;
        auVar172._20_4_ = fVar162 * auVar113._20_4_;
        auVar172._24_4_ = fVar167 * auVar113._24_4_;
        auVar172._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar172,auVar106,auVar121);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar99,auVar104);
        auVar108 = vfmadd231ps_avx512vl(auVar104,auVar99,ZEXT1632(auVar95));
        auVar104 = vmaxps_avx(auVar102,auVar108);
        uVar149 = vcmpps_avx512vl(auVar104,auVar99,2);
        local_3f0 = local_3f0 & (byte)uVar149;
        in_ZMM20 = ZEXT3264(local_600);
        in_ZMM21 = ZEXT3264(local_620);
        auVar203 = ZEXT3264(local_5a0);
        auVar201 = ZEXT3264(local_700);
        auVar197 = ZEXT1664(local_750);
        if (local_3f0 == 0) {
          local_3f0 = 0;
          auVar187 = ZEXT3264(auVar103);
          auVar160 = ZEXT3264(auVar105);
        }
        else {
          auVar45._4_4_ = auVar107._4_4_ * auVar115._4_4_;
          auVar45._0_4_ = auVar107._0_4_ * auVar115._0_4_;
          auVar45._8_4_ = auVar107._8_4_ * auVar115._8_4_;
          auVar45._12_4_ = auVar107._12_4_ * auVar115._12_4_;
          auVar45._16_4_ = auVar107._16_4_ * auVar115._16_4_;
          auVar45._20_4_ = auVar107._20_4_ * auVar115._20_4_;
          auVar45._24_4_ = auVar107._24_4_ * auVar115._24_4_;
          auVar45._28_4_ = auVar104._28_4_;
          auVar92 = vfmsub231ps_fma(auVar45,auVar106,auVar114);
          auVar46._4_4_ = auVar114._4_4_ * auVar113._4_4_;
          auVar46._0_4_ = auVar114._0_4_ * auVar113._0_4_;
          auVar46._8_4_ = auVar114._8_4_ * auVar113._8_4_;
          auVar46._12_4_ = auVar114._12_4_ * auVar113._12_4_;
          auVar46._16_4_ = auVar114._16_4_ * auVar113._16_4_;
          auVar46._20_4_ = auVar114._20_4_ * auVar113._20_4_;
          auVar46._24_4_ = auVar114._24_4_ * auVar113._24_4_;
          auVar46._28_4_ = auVar114._28_4_;
          auVar94 = vfmsub231ps_fma(auVar46,auVar101,auVar107);
          auVar47._4_4_ = auVar106._4_4_ * auVar101._4_4_;
          auVar47._0_4_ = auVar106._0_4_ * auVar101._0_4_;
          auVar47._8_4_ = auVar106._8_4_ * auVar101._8_4_;
          auVar47._12_4_ = auVar106._12_4_ * auVar101._12_4_;
          auVar47._16_4_ = auVar106._16_4_ * auVar101._16_4_;
          auVar47._20_4_ = auVar106._20_4_ * auVar101._20_4_;
          auVar47._24_4_ = auVar106._24_4_ * auVar101._24_4_;
          auVar47._28_4_ = auVar106._28_4_;
          auVar204 = vfmsub231ps_fma(auVar47,auVar113,auVar115);
          auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar204));
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar92),auVar99);
          auVar115 = vrcp14ps_avx512vl(auVar104);
          auVar23._8_4_ = 0x3f800000;
          auVar23._0_8_ = &DAT_3f8000003f800000;
          auVar23._12_4_ = 0x3f800000;
          auVar23._16_4_ = 0x3f800000;
          auVar23._20_4_ = 0x3f800000;
          auVar23._24_4_ = 0x3f800000;
          auVar23._28_4_ = 0x3f800000;
          auVar114 = vfnmadd213ps_avx512vl(auVar115,auVar104,auVar23);
          auVar95 = vfmadd132ps_fma(auVar114,auVar115,auVar115);
          auVar48._4_4_ = auVar204._4_4_ * auVar120._4_4_;
          auVar48._0_4_ = auVar204._0_4_ * auVar120._0_4_;
          auVar48._8_4_ = auVar204._8_4_ * auVar120._8_4_;
          auVar48._12_4_ = auVar204._12_4_ * auVar120._12_4_;
          auVar48._16_4_ = fVar147 * 0.0;
          auVar48._20_4_ = fVar177 * 0.0;
          auVar48._24_4_ = fVar178 * 0.0;
          auVar48._28_4_ = iVar1;
          auVar94 = vfmadd231ps_fma(auVar48,auVar111,ZEXT1632(auVar94));
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar112,ZEXT1632(auVar92));
          fVar147 = auVar95._0_4_;
          fVar177 = auVar95._4_4_;
          fVar178 = auVar95._8_4_;
          fVar179 = auVar95._12_4_;
          auVar115 = ZEXT1632(CONCAT412(auVar94._12_4_ * fVar179,
                                        CONCAT48(auVar94._8_4_ * fVar178,
                                                 CONCAT44(auVar94._4_4_ * fVar177,
                                                          auVar94._0_4_ * fVar147))));
          auVar160 = ZEXT3264(auVar115);
          auVar189._4_4_ = fVar168;
          auVar189._0_4_ = fVar168;
          auVar189._8_4_ = fVar168;
          auVar189._12_4_ = fVar168;
          auVar189._16_4_ = fVar168;
          auVar189._20_4_ = fVar168;
          auVar189._24_4_ = fVar168;
          auVar189._28_4_ = fVar168;
          uVar149 = vcmpps_avx512vl(auVar189,auVar115,2);
          uVar148 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar24._4_4_ = uVar148;
          auVar24._0_4_ = uVar148;
          auVar24._8_4_ = uVar148;
          auVar24._12_4_ = uVar148;
          auVar24._16_4_ = uVar148;
          auVar24._20_4_ = uVar148;
          auVar24._24_4_ = uVar148;
          auVar24._28_4_ = uVar148;
          uVar20 = vcmpps_avx512vl(auVar115,auVar24,2);
          local_3f0 = (byte)uVar149 & (byte)uVar20 & local_3f0;
          if (local_3f0 == 0) {
            local_3f0 = 0;
            auVar187 = ZEXT3264(auVar103);
            auVar160 = ZEXT3264(auVar105);
          }
          else {
            uVar149 = vcmpps_avx512vl(auVar104,auVar99,4);
            if ((local_3f0 & (byte)uVar149) == 0) {
              local_3f0 = 0;
              auVar187 = ZEXT3264(auVar103);
              auVar160 = ZEXT3264(auVar105);
            }
            else {
              local_3f0 = local_3f0 & (byte)uVar149;
              fVar162 = auVar102._0_4_ * fVar147;
              fVar167 = auVar102._4_4_ * fVar177;
              auVar49._4_4_ = fVar167;
              auVar49._0_4_ = fVar162;
              fVar91 = auVar102._8_4_ * fVar178;
              auVar49._8_4_ = fVar91;
              fVar161 = auVar102._12_4_ * fVar179;
              auVar49._12_4_ = fVar161;
              fVar139 = auVar102._16_4_ * 0.0;
              auVar49._16_4_ = fVar139;
              fVar140 = auVar102._20_4_ * 0.0;
              auVar49._20_4_ = fVar140;
              fVar141 = auVar102._24_4_ * 0.0;
              auVar49._24_4_ = fVar141;
              auVar49._28_4_ = auVar102._28_4_;
              fVar147 = auVar108._0_4_ * fVar147;
              fVar177 = auVar108._4_4_ * fVar177;
              auVar50._4_4_ = fVar177;
              auVar50._0_4_ = fVar147;
              fVar178 = auVar108._8_4_ * fVar178;
              auVar50._8_4_ = fVar178;
              fVar179 = auVar108._12_4_ * fVar179;
              auVar50._12_4_ = fVar179;
              fVar142 = auVar108._16_4_ * 0.0;
              auVar50._16_4_ = fVar142;
              fVar143 = auVar108._20_4_ * 0.0;
              auVar50._20_4_ = fVar143;
              fVar144 = auVar108._24_4_ * 0.0;
              auVar50._24_4_ = fVar144;
              auVar50._28_4_ = auVar108._28_4_;
              auVar182._8_4_ = 0x3f800000;
              auVar182._0_8_ = &DAT_3f8000003f800000;
              auVar182._12_4_ = 0x3f800000;
              auVar182._16_4_ = 0x3f800000;
              auVar182._20_4_ = 0x3f800000;
              auVar182._24_4_ = 0x3f800000;
              auVar182._28_4_ = 0x3f800000;
              auVar105 = vsubps_avx(auVar182,auVar49);
              bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar83 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar83 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
              bVar18 = SUB81(uVar83 >> 7,0);
              auVar187 = ZEXT3264(CONCAT428((uint)bVar18 * auVar102._28_4_ |
                                            (uint)!bVar18 * auVar105._28_4_,
                                            CONCAT424((uint)bVar17 * (int)fVar141 |
                                                      (uint)!bVar17 * auVar105._24_4_,
                                                      CONCAT420((uint)bVar16 * (int)fVar140 |
                                                                (uint)!bVar16 * auVar105._20_4_,
                                                                CONCAT416((uint)bVar15 *
                                                                          (int)fVar139 |
                                                                          (uint)!bVar15 *
                                                                          auVar105._16_4_,
                                                                          CONCAT412((uint)bVar14 *
                                                                                    (int)fVar161 |
                                                                                    (uint)!bVar14 *
                                                                                    auVar105._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar13 * (int)fVar91 |
                                                  (uint)!bVar13 * auVar105._8_4_,
                                                  CONCAT44((uint)bVar12 * (int)fVar167 |
                                                           (uint)!bVar12 * auVar105._4_4_,
                                                           (uint)(bVar86 & 1) * (int)fVar162 |
                                                           (uint)!(bool)(bVar86 & 1) *
                                                           auVar105._0_4_))))))));
              auVar105 = vsubps_avx(auVar182,auVar50);
              bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar83 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar83 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
              bVar18 = SUB81(uVar83 >> 7,0);
              local_340._4_4_ = (uint)bVar12 * (int)fVar177 | (uint)!bVar12 * auVar105._4_4_;
              local_340._0_4_ =
                   (uint)(bVar86 & 1) * (int)fVar147 | (uint)!(bool)(bVar86 & 1) * auVar105._0_4_;
              local_340._8_4_ = (uint)bVar13 * (int)fVar178 | (uint)!bVar13 * auVar105._8_4_;
              local_340._12_4_ = (uint)bVar14 * (int)fVar179 | (uint)!bVar14 * auVar105._12_4_;
              local_340._16_4_ = (uint)bVar15 * (int)fVar142 | (uint)!bVar15 * auVar105._16_4_;
              local_340._20_4_ = (uint)bVar16 * (int)fVar143 | (uint)!bVar16 * auVar105._20_4_;
              local_340._24_4_ = (uint)bVar17 * (int)fVar144 | (uint)!bVar17 * auVar105._24_4_;
              local_340._28_4_ = (uint)bVar18 * auVar108._28_4_ | (uint)!bVar18 * auVar105._28_4_;
            }
          }
        }
        auVar207 = ZEXT3264(local_680);
        auVar206 = ZEXT3264(local_660);
        if (local_3f0 != 0) {
          auVar105 = vsubps_avx(ZEXT1632(auVar93),auVar100);
          auVar104 = auVar187._0_32_;
          auVar95 = vfmadd213ps_fma(auVar105,auVar104,auVar100);
          uVar148 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar25._4_4_ = uVar148;
          auVar25._0_4_ = uVar148;
          auVar25._8_4_ = uVar148;
          auVar25._12_4_ = uVar148;
          auVar25._16_4_ = uVar148;
          auVar25._20_4_ = uVar148;
          auVar25._24_4_ = uVar148;
          auVar25._28_4_ = uVar148;
          auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar95._12_4_ + auVar95._12_4_,
                                                        CONCAT48(auVar95._8_4_ + auVar95._8_4_,
                                                                 CONCAT44(auVar95._4_4_ +
                                                                          auVar95._4_4_,
                                                                          auVar95._0_4_ +
                                                                          auVar95._0_4_)))),auVar25)
          ;
          auVar103 = auVar160._0_32_;
          uVar149 = vcmpps_avx512vl(auVar103,auVar105,6);
          local_3f0 = local_3f0 & (byte)uVar149;
          if (local_3f0 != 0) {
            local_780._0_4_ = *(undefined4 *)(prim + lVar87 * 4 + 6);
            auVar154._8_4_ = 0xbf800000;
            auVar154._0_8_ = 0xbf800000bf800000;
            auVar154._12_4_ = 0xbf800000;
            auVar154._16_4_ = 0xbf800000;
            auVar154._20_4_ = 0xbf800000;
            auVar154._24_4_ = 0xbf800000;
            auVar154._28_4_ = 0xbf800000;
            auVar26._8_4_ = 0x40000000;
            auVar26._0_8_ = 0x4000000040000000;
            auVar26._12_4_ = 0x40000000;
            auVar26._16_4_ = 0x40000000;
            auVar26._20_4_ = 0x40000000;
            auVar26._24_4_ = 0x40000000;
            auVar26._28_4_ = 0x40000000;
            local_480 = vfmadd132ps_avx512vl(local_340,auVar154,auVar26);
            local_340 = local_480;
            auVar105 = local_340;
            local_440 = 0;
            local_420 = local_550._0_8_;
            uStack_418 = local_550._8_8_;
            local_410 = local_560._0_8_;
            uStack_408 = local_560._8_8_;
            local_400 = local_570._0_8_;
            uStack_3f8 = local_570._8_8_;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              uVar83 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (uVar83 = CONCAT71((int7)((ulong)pGVar10 >> 8),1),
                    pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar147 = 1.0 / auVar194._0_4_;
              local_3e0[0] = fVar147 * (auVar187._0_4_ + 0.0);
              local_3e0[1] = fVar147 * (auVar187._4_4_ + 1.0);
              local_3e0[2] = fVar147 * (auVar187._8_4_ + 2.0);
              local_3e0[3] = fVar147 * (auVar187._12_4_ + 3.0);
              fStack_3d0 = fVar147 * (auVar187._16_4_ + 4.0);
              fStack_3cc = fVar147 * (auVar187._20_4_ + 5.0);
              fStack_3c8 = fVar147 * (auVar187._24_4_ + 6.0);
              fStack_3c4 = auVar187._28_4_ + 7.0;
              local_340._0_8_ = local_480._0_8_;
              local_340._8_8_ = local_480._8_8_;
              local_340._16_8_ = local_480._16_8_;
              local_340._24_8_ = local_480._24_8_;
              local_3c0 = local_340._0_8_;
              uStack_3b8 = local_340._8_8_;
              uStack_3b0 = local_340._16_8_;
              uStack_3a8 = local_340._24_8_;
              local_3a0 = auVar103;
              lVar87 = 0;
              uVar85 = (ulong)local_3f0;
              for (uVar83 = uVar85; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
                lVar87 = lVar87 + 1;
              }
              local_520 = vpbroadcastd_avx512vl();
              local_730 = local_550._0_8_;
              uStack_728 = local_550._8_8_;
              local_540 = vpbroadcastd_avx512vl();
              local_740 = local_560._0_4_;
              uStack_73c = local_560._4_4_;
              uStack_738 = local_560._8_8_;
              local_6c0 = local_570._0_4_;
              fStack_6bc = local_570._4_4_;
              fStack_6b8 = local_570._8_4_;
              fStack_6b4 = local_570._12_4_;
              uVar83 = CONCAT71((int7)((ulong)lVar87 >> 8),1);
              local_6a0 = fVar168;
              local_4a0 = auVar104;
              local_460 = auVar103;
              local_43c = iVar9;
              local_430 = auVar19;
              local_340 = auVar105;
              do {
                auVar204 = auVar205._0_16_;
                local_4e0 = (undefined4)uVar85;
                uStack_4dc = (undefined4)(uVar85 >> 0x20);
                local_720._0_4_ = (int)uVar83;
                local_500 = *(float *)(ray + k * 4 + 0x100);
                fVar147 = local_3e0[lVar87];
                auVar157._4_4_ = fVar147;
                auVar157._0_4_ = fVar147;
                auVar157._8_4_ = fVar147;
                auVar157._12_4_ = fVar147;
                local_260._16_4_ = fVar147;
                local_260._0_16_ = auVar157;
                local_260._20_4_ = fVar147;
                local_260._24_4_ = fVar147;
                local_260._28_4_ = fVar147;
                local_380._0_8_ = lVar87;
                local_240 = *(undefined4 *)((long)&local_3c0 + lVar87 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3a0 + lVar87 * 4);
                local_7b0.context = context->user;
                fVar177 = 1.0 - fVar147;
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar92 = vxorps_avx512vl(ZEXT416((uint)fVar177),auVar21);
                auVar95 = ZEXT416((uint)(fVar147 * fVar177 * 4.0));
                auVar94 = vfnmsub213ss_fma(auVar157,auVar157,auVar95);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)fVar177),ZEXT416((uint)fVar177),auVar95);
                fVar177 = fVar177 * auVar92._0_4_ * 0.5;
                fVar178 = auVar94._0_4_ * 0.5;
                fVar179 = auVar95._0_4_ * 0.5;
                fVar147 = fVar147 * fVar147 * 0.5;
                auVar180._0_4_ = fVar147 * local_6c0;
                auVar180._4_4_ = fVar147 * fStack_6bc;
                auVar180._8_4_ = fVar147 * fStack_6b8;
                auVar180._12_4_ = fVar147 * fStack_6b4;
                auVar150._4_4_ = fVar179;
                auVar150._0_4_ = fVar179;
                auVar150._8_4_ = fVar179;
                auVar150._12_4_ = fVar179;
                auVar72._4_4_ = uStack_73c;
                auVar72._0_4_ = local_740;
                auVar72._8_8_ = uStack_738;
                auVar95 = vfmadd132ps_fma(auVar150,auVar180,auVar72);
                auVar169._4_4_ = fVar178;
                auVar169._0_4_ = fVar178;
                auVar169._8_4_ = fVar178;
                auVar169._12_4_ = fVar178;
                auVar73._8_8_ = uStack_728;
                auVar73._0_8_ = local_730;
                auVar95 = vfmadd132ps_fma(auVar169,auVar95,auVar73);
                auVar151._4_4_ = fVar177;
                auVar151._0_4_ = fVar177;
                auVar151._8_4_ = fVar177;
                auVar151._12_4_ = fVar177;
                auVar95 = vfmadd213ps_fma(auVar151,auVar19,auVar95);
                local_2c0 = auVar95._0_4_;
                auVar173._8_4_ = 1;
                auVar173._0_8_ = 0x100000001;
                auVar173._12_4_ = 1;
                auVar173._16_4_ = 1;
                auVar173._20_4_ = 1;
                auVar173._24_4_ = 1;
                auVar173._28_4_ = 1;
                local_2a0 = vpermps_avx2(auVar173,ZEXT1632(auVar95));
                auVar183._8_4_ = 2;
                auVar183._0_8_ = 0x200000002;
                auVar183._12_4_ = 2;
                auVar183._16_4_ = 2;
                auVar183._20_4_ = 2;
                auVar183._24_4_ = 2;
                auVar183._28_4_ = 2;
                local_280 = vpermps_avx2(auVar183,ZEXT1632(auVar95));
                uStack_2bc = local_2c0;
                uStack_2b8 = local_2c0;
                uStack_2b4 = local_2c0;
                uStack_2b0 = local_2c0;
                uStack_2ac = local_2c0;
                uStack_2a8 = local_2c0;
                uStack_2a4 = local_2c0;
                uStack_23c = local_240;
                uStack_238 = local_240;
                uStack_234 = local_240;
                uStack_230 = local_240;
                uStack_22c = local_240;
                uStack_228 = local_240;
                uStack_224 = local_240;
                local_220 = local_540._0_8_;
                uStack_218 = local_540._8_8_;
                uStack_210 = local_540._16_8_;
                uStack_208 = local_540._24_8_;
                local_200 = local_520;
                vpcmpeqd_avx2(local_520,local_520);
                local_1e0 = (local_7b0.context)->instID[0];
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                local_1c0 = (local_7b0.context)->instPrimID[0];
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                local_6e0 = local_2e0._0_8_;
                uStack_6d8 = local_2e0._8_8_;
                uStack_6d0 = local_2e0._16_8_;
                uStack_6c8 = local_2e0._24_8_;
                local_7b0.valid = (int *)&local_6e0;
                local_7b0.geometryUserPtr = *(void **)(local_640._0_8_ + 0x18);
                local_7b0.hit = (RTCHitN *)&local_2c0;
                local_7b0.N = 8;
                local_7b0.ray = (RTCRayN *)ray;
                if (*(code **)(local_640._0_8_ + 0x48) != (code *)0x0) {
                  (**(code **)(local_640._0_8_ + 0x48))(&local_7b0);
                  auVar197 = ZEXT1664(local_750);
                  auVar207 = ZEXT3264(local_680);
                  auVar206 = ZEXT3264(local_660);
                  auVar201 = ZEXT3264(local_700);
                  auVar202 = ZEXT3264(local_5c0);
                  auVar203 = ZEXT3264(local_5a0);
                  in_ZMM21 = ZEXT3264(local_620);
                  in_ZMM20 = ZEXT3264(local_600);
                  auVar95 = vxorps_avx512vl(auVar204,auVar204);
                  auVar205 = ZEXT1664(auVar95);
                  fVar168 = local_6a0;
                }
                auVar95 = auVar205._0_16_;
                auVar74._8_8_ = uStack_6d8;
                auVar74._0_8_ = local_6e0;
                auVar74._16_8_ = uStack_6d0;
                auVar74._24_8_ = uStack_6c8;
                if (auVar74 == (undefined1  [32])0x0) {
                  uVar85 = CONCAT44(uStack_4dc,local_4e0);
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_640._0_8_ + 0x3e) & 0x40) != 0)))) {
                    (*p_Var11)(&local_7b0);
                    auVar197 = ZEXT1664(local_750);
                    auVar207 = ZEXT3264(local_680);
                    auVar206 = ZEXT3264(local_660);
                    auVar201 = ZEXT3264(local_700);
                    auVar202 = ZEXT3264(local_5c0);
                    auVar203 = ZEXT3264(local_5a0);
                    in_ZMM21 = ZEXT3264(local_620);
                    in_ZMM20 = ZEXT3264(local_600);
                    auVar95 = vxorps_avx512vl(auVar95,auVar95);
                    auVar205 = ZEXT1664(auVar95);
                    fVar168 = local_6a0;
                  }
                  auVar75._8_8_ = uStack_6d8;
                  auVar75._0_8_ = local_6e0;
                  auVar75._16_8_ = uStack_6d0;
                  auVar75._24_8_ = uStack_6c8;
                  uVar83 = vptestmd_avx512vl(auVar75,auVar75);
                  auVar105 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar12 = (bool)((byte)uVar83 & 1);
                  auVar126._0_4_ =
                       (uint)bVar12 * auVar105._0_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x100);
                  bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
                  auVar126._4_4_ =
                       (uint)bVar12 * auVar105._4_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x104);
                  bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
                  auVar126._8_4_ =
                       (uint)bVar12 * auVar105._8_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x108);
                  bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
                  auVar126._12_4_ =
                       (uint)bVar12 * auVar105._12_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x10c);
                  bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
                  auVar126._16_4_ =
                       (uint)bVar12 * auVar105._16_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x110);
                  bVar12 = (bool)((byte)(uVar83 >> 5) & 1);
                  auVar126._20_4_ =
                       (uint)bVar12 * auVar105._20_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x114);
                  bVar12 = (bool)((byte)(uVar83 >> 6) & 1);
                  auVar126._24_4_ =
                       (uint)bVar12 * auVar105._24_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x118);
                  bVar12 = SUB81(uVar83 >> 7,0);
                  auVar126._28_4_ =
                       (uint)bVar12 * auVar105._28_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x11c);
                  *(undefined1 (*) [32])(local_7b0.ray + 0x100) = auVar126;
                  uVar85 = CONCAT44(uStack_4dc,local_4e0);
                  if (auVar75 != (undefined1  [32])0x0) {
                    uVar83 = (ulong)(uint)local_720._0_4_;
                    fVar147 = auVar197._0_4_;
                    break;
                  }
                }
                *(float *)(ray + k * 4 + 0x100) = local_500;
                lVar87 = 0;
                uVar85 = uVar85 ^ 1L << (local_380._0_8_ & 0x3f);
                for (uVar83 = uVar85; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000)
                {
                  lVar87 = lVar87 + 1;
                }
                uVar83 = CONCAT71((int7)((ulong)pre >> 8),uVar85 != 0);
                fVar147 = auVar197._0_4_;
              } while (uVar85 != 0);
              local_6a0 = fVar147;
              auVar187 = ZEXT3264(auVar104);
              auVar160 = ZEXT3264(auVar103);
              uVar83 = uVar83 & 0xffffffffffffff01;
            }
            uVar83 = uVar83 & 0xffffffff;
            goto LAB_01d58ceb;
          }
        }
        uVar83 = 0;
      }
LAB_01d58ceb:
      if (8 < iVar9) {
        local_640 = vpbroadcastd_avx512vl();
        local_500 = 1.0 / (float)local_4c0._0_4_;
        auVar81._28_4_ = 0;
        auVar81._0_28_ = stack0xfffffffffffff884;
        _local_780 = auVar81 << 0x20;
        local_4c0 = vpbroadcastd_avx512vl();
        local_380 = vpbroadcastd_avx512vl();
        lVar87 = 8;
        auVar103 = auVar187._0_32_;
        auVar105 = auVar160._0_32_;
        fStack_69c = local_6a0;
        fStack_698 = local_6a0;
        fStack_694 = local_6a0;
        fStack_690 = local_6a0;
        fStack_68c = local_6a0;
        fStack_688 = local_6a0;
        fStack_684 = local_6a0;
        fStack_4fc = local_500;
        fStack_4f8 = local_500;
        fStack_4f4 = local_500;
        fStack_4f0 = local_500;
        fStack_4ec = local_500;
        fStack_4e8 = local_500;
        fStack_4e4 = local_500;
        local_4e0 = fVar168;
        uStack_4dc = fVar168;
        uStack_4d8 = fVar168;
        uStack_4d4 = fVar168;
        uStack_4d0 = fVar168;
        uStack_4cc = fVar168;
        uStack_4c8 = fVar168;
        uStack_4c4 = fVar168;
        do {
          uVar82 = (uint)uVar83;
          local_720._0_4_ = uVar82;
          auVar104 = vpbroadcastd_avx512vl();
          auVar106 = vpor_avx2(auVar104,_DAT_0205a920);
          uVar20 = vpcmpd_avx512vl(auVar106,local_640,1);
          auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 * 4 + lVar70);
          auVar115 = *(undefined1 (*) [32])(lVar70 + 0x222bfac + lVar87 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar70 + 0x222c430 + lVar87 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar70 + 0x222c8b4 + lVar87 * 4);
          local_660 = auVar206._0_32_;
          auVar107 = vmulps_avx512vl(local_660,auVar113);
          local_680 = auVar207._0_32_;
          auVar112 = vmulps_avx512vl(local_680,auVar113);
          auVar51._4_4_ = auVar113._4_4_ * (float)local_140._4_4_;
          auVar51._0_4_ = auVar113._0_4_ * (float)local_140._0_4_;
          auVar51._8_4_ = auVar113._8_4_ * fStack_138;
          auVar51._12_4_ = auVar113._12_4_ * fStack_134;
          auVar51._16_4_ = auVar113._16_4_ * fStack_130;
          auVar51._20_4_ = auVar113._20_4_ * fStack_12c;
          auVar51._24_4_ = auVar113._24_4_ * fStack_128;
          auVar51._28_4_ = auVar106._28_4_;
          auVar106 = vfmadd231ps_avx512vl(auVar107,auVar114,local_a0);
          auVar107 = vfmadd231ps_avx512vl(auVar112,auVar114,local_c0);
          auVar112 = vfmadd231ps_avx512vl(auVar51,auVar114,local_120);
          auVar186 = auVar201._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,auVar186);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar115,local_320);
          auVar95 = vfmadd231ps_fma(auVar112,auVar115,local_100);
          auVar195 = auVar203._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar106,auVar104,auVar195);
          auVar188 = auVar202._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar188);
          auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 * 4 + lVar70);
          auVar107 = *(undefined1 (*) [32])(lVar70 + 0x222e3cc + lVar87 * 4);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar104,local_e0);
          auVar112 = *(undefined1 (*) [32])(lVar70 + 0x222e850 + lVar87 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar70 + 0x222ecd4 + lVar87 * 4);
          auVar101 = vmulps_avx512vl(local_660,auVar111);
          auVar102 = vmulps_avx512vl(local_680,auVar111);
          auVar52._4_4_ = auVar111._4_4_ * (float)local_140._4_4_;
          auVar52._0_4_ = auVar111._0_4_ * (float)local_140._0_4_;
          auVar52._8_4_ = auVar111._8_4_ * fStack_138;
          auVar52._12_4_ = auVar111._12_4_ * fStack_134;
          auVar52._16_4_ = auVar111._16_4_ * fStack_130;
          auVar52._20_4_ = auVar111._20_4_ * fStack_12c;
          auVar52._24_4_ = auVar111._24_4_ * fStack_128;
          auVar52._28_4_ = uStack_124;
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar112,local_a0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar112,local_c0);
          auVar100 = vfmadd231ps_avx512vl(auVar52,auVar112,local_120);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar186);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_320);
          auVar94 = vfmadd231ps_fma(auVar100,auVar107,local_100);
          auVar100 = vfmadd231ps_avx512vl(auVar101,auVar106,auVar195);
          auVar109 = vfmadd231ps_avx512vl(auVar102,auVar106,auVar188);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,local_e0);
          auVar110 = vmaxps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar94));
          auVar101 = vsubps_avx(auVar100,auVar108);
          auVar102 = vsubps_avx(auVar109,auVar99);
          auVar127 = vmulps_avx512vl(auVar99,auVar101);
          auVar128 = vmulps_avx512vl(auVar108,auVar102);
          auVar127 = vsubps_avx512vl(auVar127,auVar128);
          auVar128 = vmulps_avx512vl(auVar102,auVar102);
          auVar128 = vfmadd231ps_avx512vl(auVar128,auVar101,auVar101);
          auVar110 = vmulps_avx512vl(auVar110,auVar110);
          auVar110 = vmulps_avx512vl(auVar110,auVar128);
          auVar127 = vmulps_avx512vl(auVar127,auVar127);
          uVar149 = vcmpps_avx512vl(auVar127,auVar110,2);
          local_3f0 = (byte)uVar20 & (byte)uVar149;
          if (local_3f0 == 0) {
            auVar201 = ZEXT3264(auVar186);
LAB_01d59965:
            auVar197 = ZEXT3264(auVar188);
          }
          else {
            auVar111 = vmulps_avx512vl(local_5e0,auVar111);
            auVar112 = vfmadd213ps_avx512vl(auVar112,local_1a0,auVar111);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar112);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_160,auVar107);
            auVar113 = vmulps_avx512vl(local_5e0,auVar113);
            auVar114 = vfmadd213ps_avx512vl(auVar114,local_1a0,auVar113);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_180,auVar114);
            auVar107 = vfmadd213ps_avx512vl(auVar104,local_160,auVar115);
            auVar104 = *(undefined1 (*) [32])(lVar70 + 0x222cd38 + lVar87 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar70 + 0x222d1bc + lVar87 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar70 + 0x222d640 + lVar87 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar70 + 0x222dac4 + lVar87 * 4);
            auVar112 = vmulps_avx512vl(local_660,auVar113);
            auVar111 = vmulps_avx512vl(local_680,auVar113);
            auVar113 = vmulps_avx512vl(local_5e0,auVar113);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,local_a0);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,local_c0);
            auVar114 = vfmadd231ps_avx512vl(auVar113,local_1a0,auVar114);
            auVar113 = vfmadd231ps_avx512vl(auVar112,auVar115,auVar186);
            auVar112 = vfmadd231ps_avx512vl(auVar111,auVar115,local_320);
            auVar115 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar104,auVar195);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar104,auVar188);
            auVar111 = vfmadd231ps_avx512vl(auVar115,local_160,auVar104);
            auVar104 = *(undefined1 (*) [32])(lVar70 + 0x222f158 + lVar87 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar70 + 0x222fa60 + lVar87 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar70 + 0x222fee4 + lVar87 * 4);
            auVar110 = vmulps_avx512vl(local_660,auVar114);
            auVar127 = vmulps_avx512vl(local_680,auVar114);
            auVar114 = vmulps_avx512vl(local_5e0,auVar114);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_a0);
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar115,local_c0);
            auVar114 = vfmadd231ps_avx512vl(auVar114,local_1a0,auVar115);
            auVar115 = *(undefined1 (*) [32])(lVar70 + 0x222f5dc + lVar87 * 4);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,auVar186);
            auVar92 = vfmadd231ps_fma(auVar127,auVar115,local_320);
            auVar115 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
            auVar114 = vfmadd231ps_avx512vl(auVar110,auVar104,auVar195);
            auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar104,auVar188);
            auVar115 = vfmadd231ps_avx512vl(auVar115,local_160,auVar104);
            auVar127 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar113,auVar127);
            vandps_avx512vl(auVar112,auVar127);
            auVar104 = vmaxps_avx(auVar127,auVar127);
            vandps_avx512vl(auVar111,auVar127);
            auVar104 = vmaxps_avx(auVar104,auVar127);
            auVar79._4_4_ = fStack_69c;
            auVar79._0_4_ = local_6a0;
            auVar79._8_4_ = fStack_698;
            auVar79._12_4_ = fStack_694;
            auVar79._16_4_ = fStack_690;
            auVar79._20_4_ = fStack_68c;
            auVar79._24_4_ = fStack_688;
            auVar79._28_4_ = fStack_684;
            uVar83 = vcmpps_avx512vl(auVar104,auVar79,1);
            bVar12 = (bool)((byte)uVar83 & 1);
            auVar129._0_4_ = (float)((uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar113._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar113._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar113._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar113._12_4_);
            bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar129._16_4_ =
                 (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar113._16_4_);
            bVar12 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar129._20_4_ =
                 (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar113._20_4_);
            bVar12 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar129._24_4_ =
                 (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar113._24_4_);
            bVar12 = SUB81(uVar83 >> 7,0);
            auVar129._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar113._28_4_;
            bVar12 = (bool)((byte)uVar83 & 1);
            auVar130._0_4_ = (float)((uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar112._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar112._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar112._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar112._12_4_);
            bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * auVar112._16_4_);
            bVar12 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * auVar112._20_4_);
            bVar12 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * auVar112._24_4_);
            bVar12 = SUB81(uVar83 >> 7,0);
            auVar130._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * auVar112._28_4_;
            vandps_avx512vl(auVar114,auVar127);
            vandps_avx512vl(auVar110,auVar127);
            auVar104 = vmaxps_avx(auVar130,auVar130);
            vandps_avx512vl(auVar115,auVar127);
            auVar104 = vmaxps_avx(auVar104,auVar130);
            uVar83 = vcmpps_avx512vl(auVar104,auVar79,1);
            bVar12 = (bool)((byte)uVar83 & 1);
            auVar131._0_4_ = (uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar114._0_4_;
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar114._4_4_;
            bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar114._8_4_;
            bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar114._12_4_;
            bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar131._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar114._16_4_;
            bVar12 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar131._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar114._20_4_;
            bVar12 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar131._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar114._24_4_;
            bVar12 = SUB81(uVar83 >> 7,0);
            auVar131._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar114._28_4_;
            bVar12 = (bool)((byte)uVar83 & 1);
            auVar132._0_4_ = (float)((uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar110._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar110._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar110._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar110._12_4_);
            bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar132._16_4_ =
                 (float)((uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * auVar110._16_4_);
            bVar12 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar132._20_4_ =
                 (float)((uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * auVar110._20_4_);
            bVar12 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar132._24_4_ =
                 (float)((uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * auVar110._24_4_);
            bVar12 = SUB81(uVar83 >> 7,0);
            auVar132._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * auVar110._28_4_;
            auVar191._8_4_ = 0x80000000;
            auVar191._0_8_ = 0x8000000080000000;
            auVar191._12_4_ = 0x80000000;
            auVar191._16_4_ = 0x80000000;
            auVar191._20_4_ = 0x80000000;
            auVar191._24_4_ = 0x80000000;
            auVar191._28_4_ = 0x80000000;
            auVar104 = vxorps_avx512vl(auVar131,auVar191);
            auVar110 = auVar205._0_32_;
            auVar115 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar110);
            auVar92 = vfmadd231ps_fma(auVar115,auVar130,auVar130);
            auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
            auVar200._8_4_ = 0xbf000000;
            auVar200._0_8_ = 0xbf000000bf000000;
            auVar200._12_4_ = 0xbf000000;
            auVar200._16_4_ = 0xbf000000;
            auVar200._20_4_ = 0xbf000000;
            auVar200._24_4_ = 0xbf000000;
            auVar200._28_4_ = 0xbf000000;
            fVar168 = auVar115._0_4_;
            fVar147 = auVar115._4_4_;
            fVar177 = auVar115._8_4_;
            fVar178 = auVar115._12_4_;
            fVar179 = auVar115._16_4_;
            fVar162 = auVar115._20_4_;
            fVar167 = auVar115._24_4_;
            auVar53._4_4_ = fVar147 * fVar147 * fVar147 * auVar92._4_4_ * -0.5;
            auVar53._0_4_ = fVar168 * fVar168 * fVar168 * auVar92._0_4_ * -0.5;
            auVar53._8_4_ = fVar177 * fVar177 * fVar177 * auVar92._8_4_ * -0.5;
            auVar53._12_4_ = fVar178 * fVar178 * fVar178 * auVar92._12_4_ * -0.5;
            auVar53._16_4_ = fVar179 * fVar179 * fVar179 * -0.0;
            auVar53._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
            auVar53._24_4_ = fVar167 * fVar167 * fVar167 * -0.0;
            auVar53._28_4_ = auVar130._28_4_;
            auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar115 = vfmadd231ps_avx512vl(auVar53,auVar114,auVar115);
            auVar54._4_4_ = auVar130._4_4_ * auVar115._4_4_;
            auVar54._0_4_ = auVar130._0_4_ * auVar115._0_4_;
            auVar54._8_4_ = auVar130._8_4_ * auVar115._8_4_;
            auVar54._12_4_ = auVar130._12_4_ * auVar115._12_4_;
            auVar54._16_4_ = auVar130._16_4_ * auVar115._16_4_;
            auVar54._20_4_ = auVar130._20_4_ * auVar115._20_4_;
            auVar54._24_4_ = auVar130._24_4_ * auVar115._24_4_;
            auVar54._28_4_ = 0;
            auVar55._4_4_ = auVar115._4_4_ * -auVar129._4_4_;
            auVar55._0_4_ = auVar115._0_4_ * -auVar129._0_4_;
            auVar55._8_4_ = auVar115._8_4_ * -auVar129._8_4_;
            auVar55._12_4_ = auVar115._12_4_ * -auVar129._12_4_;
            auVar55._16_4_ = auVar115._16_4_ * -auVar129._16_4_;
            auVar55._20_4_ = auVar115._20_4_ * -auVar129._20_4_;
            auVar55._24_4_ = auVar115._24_4_ * -auVar129._24_4_;
            auVar55._28_4_ = auVar130._28_4_;
            auVar113 = vmulps_avx512vl(auVar115,auVar110);
            auVar115 = vfmadd213ps_avx512vl(auVar131,auVar131,auVar110);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar132,auVar132);
            auVar112 = vrsqrt14ps_avx512vl(auVar115);
            auVar115 = vmulps_avx512vl(auVar115,auVar200);
            fVar168 = auVar112._0_4_;
            fVar147 = auVar112._4_4_;
            fVar177 = auVar112._8_4_;
            fVar178 = auVar112._12_4_;
            fVar179 = auVar112._16_4_;
            fVar162 = auVar112._20_4_;
            fVar167 = auVar112._24_4_;
            auVar56._4_4_ = fVar147 * fVar147 * fVar147 * auVar115._4_4_;
            auVar56._0_4_ = fVar168 * fVar168 * fVar168 * auVar115._0_4_;
            auVar56._8_4_ = fVar177 * fVar177 * fVar177 * auVar115._8_4_;
            auVar56._12_4_ = fVar178 * fVar178 * fVar178 * auVar115._12_4_;
            auVar56._16_4_ = fVar179 * fVar179 * fVar179 * auVar115._16_4_;
            auVar56._20_4_ = fVar162 * fVar162 * fVar162 * auVar115._20_4_;
            auVar56._24_4_ = fVar167 * fVar167 * fVar167 * auVar115._24_4_;
            auVar56._28_4_ = auVar115._28_4_;
            auVar115 = vfmadd231ps_avx512vl(auVar56,auVar114,auVar112);
            auVar57._4_4_ = auVar132._4_4_ * auVar115._4_4_;
            auVar57._0_4_ = auVar132._0_4_ * auVar115._0_4_;
            auVar57._8_4_ = auVar132._8_4_ * auVar115._8_4_;
            auVar57._12_4_ = auVar132._12_4_ * auVar115._12_4_;
            auVar57._16_4_ = auVar132._16_4_ * auVar115._16_4_;
            auVar57._20_4_ = auVar132._20_4_ * auVar115._20_4_;
            auVar57._24_4_ = auVar132._24_4_ * auVar115._24_4_;
            auVar57._28_4_ = auVar112._28_4_;
            auVar58._4_4_ = auVar115._4_4_ * auVar104._4_4_;
            auVar58._0_4_ = auVar115._0_4_ * auVar104._0_4_;
            auVar58._8_4_ = auVar115._8_4_ * auVar104._8_4_;
            auVar58._12_4_ = auVar115._12_4_ * auVar104._12_4_;
            auVar58._16_4_ = auVar115._16_4_ * auVar104._16_4_;
            auVar58._20_4_ = auVar115._20_4_ * auVar104._20_4_;
            auVar58._24_4_ = auVar115._24_4_ * auVar104._24_4_;
            auVar58._28_4_ = auVar104._28_4_;
            auVar104 = vmulps_avx512vl(auVar115,auVar110);
            auVar92 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar95),auVar108);
            auVar115 = ZEXT1632(auVar95);
            auVar204 = vfmadd213ps_fma(auVar55,auVar115,auVar99);
            auVar114 = vfmadd213ps_avx512vl(auVar113,auVar115,auVar107);
            auVar112 = vfmadd213ps_avx512vl(auVar57,ZEXT1632(auVar94),auVar100);
            auVar96 = vfnmadd213ps_fma(auVar54,auVar115,auVar108);
            auVar111 = ZEXT1632(auVar94);
            auVar5 = vfmadd213ps_fma(auVar58,auVar111,auVar109);
            auVar97 = vfnmadd213ps_fma(auVar55,auVar115,auVar99);
            auVar6 = vfmadd213ps_fma(auVar104,auVar111,auVar106);
            auVar99 = ZEXT1632(auVar95);
            auVar98 = vfnmadd231ps_fma(auVar107,auVar99,auVar113);
            auVar163 = vfnmadd213ps_fma(auVar57,auVar111,auVar100);
            auVar164 = vfnmadd213ps_fma(auVar58,auVar111,auVar109);
            auVar190 = vfnmadd231ps_fma(auVar106,ZEXT1632(auVar94),auVar104);
            auVar106 = vsubps_avx512vl(auVar112,ZEXT1632(auVar96));
            auVar104 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar97));
            auVar115 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar98));
            auVar59._4_4_ = auVar104._4_4_ * auVar98._4_4_;
            auVar59._0_4_ = auVar104._0_4_ * auVar98._0_4_;
            auVar59._8_4_ = auVar104._8_4_ * auVar98._8_4_;
            auVar59._12_4_ = auVar104._12_4_ * auVar98._12_4_;
            auVar59._16_4_ = auVar104._16_4_ * 0.0;
            auVar59._20_4_ = auVar104._20_4_ * 0.0;
            auVar59._24_4_ = auVar104._24_4_ * 0.0;
            auVar59._28_4_ = auVar113._28_4_;
            auVar95 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar97),auVar115);
            auVar60._4_4_ = auVar115._4_4_ * auVar96._4_4_;
            auVar60._0_4_ = auVar115._0_4_ * auVar96._0_4_;
            auVar60._8_4_ = auVar115._8_4_ * auVar96._8_4_;
            auVar60._12_4_ = auVar115._12_4_ * auVar96._12_4_;
            auVar60._16_4_ = auVar115._16_4_ * 0.0;
            auVar60._20_4_ = auVar115._20_4_ * 0.0;
            auVar60._24_4_ = auVar115._24_4_ * 0.0;
            auVar60._28_4_ = auVar115._28_4_;
            auVar7 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar98),auVar106);
            auVar61._4_4_ = auVar97._4_4_ * auVar106._4_4_;
            auVar61._0_4_ = auVar97._0_4_ * auVar106._0_4_;
            auVar61._8_4_ = auVar97._8_4_ * auVar106._8_4_;
            auVar61._12_4_ = auVar97._12_4_ * auVar106._12_4_;
            auVar61._16_4_ = auVar106._16_4_ * 0.0;
            auVar61._20_4_ = auVar106._20_4_ * 0.0;
            auVar61._24_4_ = auVar106._24_4_ * 0.0;
            auVar61._28_4_ = auVar106._28_4_;
            auVar93 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar96),auVar104);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar110,ZEXT1632(auVar7));
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,ZEXT1632(auVar95));
            uVar83 = vcmpps_avx512vl(auVar104,auVar110,2);
            bVar86 = (byte)uVar83;
            fVar139 = (float)((uint)(bVar86 & 1) * auVar92._0_4_ |
                             (uint)!(bool)(bVar86 & 1) * auVar163._0_4_);
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar141 = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar163._4_4_);
            bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar143 = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar163._8_4_);
            bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar145 = (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar163._12_4_);
            auVar111 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar143,CONCAT44(fVar141,fVar139))));
            fVar140 = (float)((uint)(bVar86 & 1) * auVar204._0_4_ |
                             (uint)!(bool)(bVar86 & 1) * auVar164._0_4_);
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar142 = (float)((uint)bVar12 * auVar204._4_4_ | (uint)!bVar12 * auVar164._4_4_);
            bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar144 = (float)((uint)bVar12 * auVar204._8_4_ | (uint)!bVar12 * auVar164._8_4_);
            bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar146 = (float)((uint)bVar12 * auVar204._12_4_ | (uint)!bVar12 * auVar164._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar144,CONCAT44(fVar142,fVar140))));
            auVar133._0_4_ =
                 (float)((uint)(bVar86 & 1) * auVar114._0_4_ |
                        (uint)!(bool)(bVar86 & 1) * auVar190._0_4_);
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar190._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar190._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar190._12_4_);
            fVar177 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar114._16_4_);
            auVar133._16_4_ = fVar177;
            fVar147 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar114._20_4_);
            auVar133._20_4_ = fVar147;
            fVar168 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar114._24_4_);
            auVar133._24_4_ = fVar168;
            iVar1 = (uint)(byte)(uVar83 >> 7) * auVar114._28_4_;
            auVar133._28_4_ = iVar1;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar96),auVar112);
            auVar134._0_4_ =
                 (uint)(bVar86 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar95._0_4_;
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar95._4_4_;
            bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar95._8_4_;
            bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar95._12_4_;
            auVar134._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar104._16_4_;
            auVar134._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar104._20_4_;
            auVar134._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar104._24_4_;
            auVar134._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar5));
            auVar135._0_4_ =
                 (float)((uint)(bVar86 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar86 & 1) * auVar92._0_4_);
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar92._4_4_);
            bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar92._8_4_);
            bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar92._12_4_);
            fVar178 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar104._16_4_);
            auVar135._16_4_ = fVar178;
            fVar179 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar104._20_4_);
            auVar135._20_4_ = fVar179;
            fVar162 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar104._24_4_);
            auVar135._24_4_ = fVar162;
            auVar135._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar6));
            auVar136._0_4_ =
                 (float)((uint)(bVar86 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar86 & 1) * auVar204._0_4_);
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar204._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar204._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar204._12_4_);
            fVar161 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar104._16_4_);
            auVar136._16_4_ = fVar161;
            fVar167 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar104._20_4_);
            auVar136._20_4_ = fVar167;
            fVar91 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar104._24_4_);
            auVar136._24_4_ = fVar91;
            iVar2 = (uint)(byte)(uVar83 >> 7) * auVar104._28_4_;
            auVar136._28_4_ = iVar2;
            auVar137._0_4_ =
                 (uint)(bVar86 & 1) * (int)auVar96._0_4_ |
                 (uint)!(bool)(bVar86 & 1) * auVar112._0_4_;
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar137._4_4_ = (uint)bVar12 * (int)auVar96._4_4_ | (uint)!bVar12 * auVar112._4_4_;
            bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar137._8_4_ = (uint)bVar12 * (int)auVar96._8_4_ | (uint)!bVar12 * auVar112._8_4_;
            bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar137._12_4_ = (uint)bVar12 * (int)auVar96._12_4_ | (uint)!bVar12 * auVar112._12_4_;
            auVar137._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar112._16_4_;
            auVar137._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar112._20_4_;
            auVar137._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar112._24_4_;
            auVar137._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar112._28_4_;
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar112 = vsubps_avx512vl(auVar137,auVar111);
            auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar97._12_4_ |
                                                     (uint)!bVar16 * auVar5._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar97._8_4_ |
                                                              (uint)!bVar14 * auVar5._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar97._4_4_ |
                                                                       (uint)!bVar12 * auVar5._4_4_,
                                                                       (uint)(bVar86 & 1) *
                                                                       (int)auVar97._0_4_ |
                                                                       (uint)!(bool)(bVar86 & 1) *
                                                                       auVar5._0_4_)))),auVar101);
            auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar98._12_4_ |
                                                     (uint)!bVar17 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar98._8_4_ |
                                                              (uint)!bVar15 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar98._4_4_ |
                                                                       (uint)!bVar13 * auVar6._4_4_,
                                                                       (uint)(bVar86 & 1) *
                                                                       (int)auVar98._0_4_ |
                                                                       (uint)!(bool)(bVar86 & 1) *
                                                                       auVar6._0_4_)))),auVar133);
            auVar113 = vsubps_avx(auVar111,auVar134);
            auVar106 = vsubps_avx(auVar101,auVar135);
            auVar107 = vsubps_avx(auVar133,auVar136);
            auVar62._4_4_ = auVar114._4_4_ * fVar141;
            auVar62._0_4_ = auVar114._0_4_ * fVar139;
            auVar62._8_4_ = auVar114._8_4_ * fVar143;
            auVar62._12_4_ = auVar114._12_4_ * fVar145;
            auVar62._16_4_ = auVar114._16_4_ * 0.0;
            auVar62._20_4_ = auVar114._20_4_ * 0.0;
            auVar62._24_4_ = auVar114._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar62,auVar133,auVar112);
            auVar166._0_4_ = fVar140 * auVar112._0_4_;
            auVar166._4_4_ = fVar142 * auVar112._4_4_;
            auVar166._8_4_ = fVar144 * auVar112._8_4_;
            auVar166._12_4_ = fVar146 * auVar112._12_4_;
            auVar166._16_4_ = auVar112._16_4_ * 0.0;
            auVar166._20_4_ = auVar112._20_4_ * 0.0;
            auVar166._24_4_ = auVar112._24_4_ * 0.0;
            auVar166._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar166,auVar111,auVar115);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar110,ZEXT1632(auVar95));
            auVar174._0_4_ = auVar115._0_4_ * auVar133._0_4_;
            auVar174._4_4_ = auVar115._4_4_ * auVar133._4_4_;
            auVar174._8_4_ = auVar115._8_4_ * auVar133._8_4_;
            auVar174._12_4_ = auVar115._12_4_ * auVar133._12_4_;
            auVar174._16_4_ = auVar115._16_4_ * fVar177;
            auVar174._20_4_ = auVar115._20_4_ * fVar147;
            auVar174._24_4_ = auVar115._24_4_ * fVar168;
            auVar174._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar174,auVar101,auVar114);
            auVar102 = vfmadd231ps_avx512vl(auVar104,auVar110,ZEXT1632(auVar95));
            auVar104 = vmulps_avx512vl(auVar107,auVar134);
            auVar104 = vfmsub231ps_avx512vl(auVar104,auVar113,auVar136);
            auVar63._4_4_ = auVar106._4_4_ * auVar136._4_4_;
            auVar63._0_4_ = auVar106._0_4_ * auVar136._0_4_;
            auVar63._8_4_ = auVar106._8_4_ * auVar136._8_4_;
            auVar63._12_4_ = auVar106._12_4_ * auVar136._12_4_;
            auVar63._16_4_ = auVar106._16_4_ * fVar161;
            auVar63._20_4_ = auVar106._20_4_ * fVar167;
            auVar63._24_4_ = auVar106._24_4_ * fVar91;
            auVar63._28_4_ = iVar2;
            auVar95 = vfmsub231ps_fma(auVar63,auVar135,auVar107);
            auVar175._0_4_ = auVar135._0_4_ * auVar113._0_4_;
            auVar175._4_4_ = auVar135._4_4_ * auVar113._4_4_;
            auVar175._8_4_ = auVar135._8_4_ * auVar113._8_4_;
            auVar175._12_4_ = auVar135._12_4_ * auVar113._12_4_;
            auVar175._16_4_ = fVar178 * auVar113._16_4_;
            auVar175._20_4_ = fVar179 * auVar113._20_4_;
            auVar175._24_4_ = fVar162 * auVar113._24_4_;
            auVar175._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar175,auVar106,auVar134);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar110,auVar104);
            auVar108 = vfmadd231ps_avx512vl(auVar104,auVar110,ZEXT1632(auVar95));
            auVar104 = vmaxps_avx(auVar102,auVar108);
            uVar149 = vcmpps_avx512vl(auVar104,auVar110,2);
            local_3f0 = local_3f0 & (byte)uVar149;
            auVar197 = ZEXT3264(auVar188);
            if (local_3f0 == 0) {
LAB_01d599a6:
              local_3f0 = 0;
            }
            else {
              auVar64._4_4_ = auVar107._4_4_ * auVar115._4_4_;
              auVar64._0_4_ = auVar107._0_4_ * auVar115._0_4_;
              auVar64._8_4_ = auVar107._8_4_ * auVar115._8_4_;
              auVar64._12_4_ = auVar107._12_4_ * auVar115._12_4_;
              auVar64._16_4_ = auVar107._16_4_ * auVar115._16_4_;
              auVar64._20_4_ = auVar107._20_4_ * auVar115._20_4_;
              auVar64._24_4_ = auVar107._24_4_ * auVar115._24_4_;
              auVar64._28_4_ = auVar104._28_4_;
              auVar204 = vfmsub231ps_fma(auVar64,auVar106,auVar114);
              auVar65._4_4_ = auVar114._4_4_ * auVar113._4_4_;
              auVar65._0_4_ = auVar114._0_4_ * auVar113._0_4_;
              auVar65._8_4_ = auVar114._8_4_ * auVar113._8_4_;
              auVar65._12_4_ = auVar114._12_4_ * auVar113._12_4_;
              auVar65._16_4_ = auVar114._16_4_ * auVar113._16_4_;
              auVar65._20_4_ = auVar114._20_4_ * auVar113._20_4_;
              auVar65._24_4_ = auVar114._24_4_ * auVar113._24_4_;
              auVar65._28_4_ = auVar114._28_4_;
              auVar92 = vfmsub231ps_fma(auVar65,auVar112,auVar107);
              auVar66._4_4_ = auVar106._4_4_ * auVar112._4_4_;
              auVar66._0_4_ = auVar106._0_4_ * auVar112._0_4_;
              auVar66._8_4_ = auVar106._8_4_ * auVar112._8_4_;
              auVar66._12_4_ = auVar106._12_4_ * auVar112._12_4_;
              auVar66._16_4_ = auVar106._16_4_ * auVar112._16_4_;
              auVar66._20_4_ = auVar106._20_4_ * auVar112._20_4_;
              auVar66._24_4_ = auVar106._24_4_ * auVar112._24_4_;
              auVar66._28_4_ = auVar106._28_4_;
              auVar5 = vfmsub231ps_fma(auVar66,auVar113,auVar115);
              auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar5));
              auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar204),auVar110);
              auVar115 = vrcp14ps_avx512vl(auVar104);
              auVar28._8_4_ = 0x3f800000;
              auVar28._0_8_ = &DAT_3f8000003f800000;
              auVar28._12_4_ = 0x3f800000;
              auVar28._16_4_ = 0x3f800000;
              auVar28._20_4_ = 0x3f800000;
              auVar28._24_4_ = 0x3f800000;
              auVar28._28_4_ = 0x3f800000;
              auVar114 = vfnmadd213ps_avx512vl(auVar115,auVar104,auVar28);
              auVar95 = vfmadd132ps_fma(auVar114,auVar115,auVar115);
              auVar67._4_4_ = auVar5._4_4_ * auVar133._4_4_;
              auVar67._0_4_ = auVar5._0_4_ * auVar133._0_4_;
              auVar67._8_4_ = auVar5._8_4_ * auVar133._8_4_;
              auVar67._12_4_ = auVar5._12_4_ * auVar133._12_4_;
              auVar67._16_4_ = fVar177 * 0.0;
              auVar67._20_4_ = fVar147 * 0.0;
              auVar67._24_4_ = fVar168 * 0.0;
              auVar67._28_4_ = iVar1;
              auVar92 = vfmadd231ps_fma(auVar67,auVar101,ZEXT1632(auVar92));
              auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar111,ZEXT1632(auVar204));
              fVar168 = auVar95._0_4_;
              fVar147 = auVar95._4_4_;
              fVar177 = auVar95._8_4_;
              fVar178 = auVar95._12_4_;
              auVar115 = ZEXT1632(CONCAT412(auVar92._12_4_ * fVar178,
                                            CONCAT48(auVar92._8_4_ * fVar177,
                                                     CONCAT44(auVar92._4_4_ * fVar147,
                                                              auVar92._0_4_ * fVar168))));
              auVar80._4_4_ = uStack_4dc;
              auVar80._0_4_ = local_4e0;
              auVar80._8_4_ = uStack_4d8;
              auVar80._12_4_ = uStack_4d4;
              auVar80._16_4_ = uStack_4d0;
              auVar80._20_4_ = uStack_4cc;
              auVar80._24_4_ = uStack_4c8;
              auVar80._28_4_ = uStack_4c4;
              uVar149 = vcmpps_avx512vl(auVar115,auVar80,0xd);
              uVar148 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar29._4_4_ = uVar148;
              auVar29._0_4_ = uVar148;
              auVar29._8_4_ = uVar148;
              auVar29._12_4_ = uVar148;
              auVar29._16_4_ = uVar148;
              auVar29._20_4_ = uVar148;
              auVar29._24_4_ = uVar148;
              auVar29._28_4_ = uVar148;
              uVar20 = vcmpps_avx512vl(auVar115,auVar29,2);
              local_3f0 = (byte)uVar149 & (byte)uVar20 & local_3f0;
              if (local_3f0 == 0) goto LAB_01d599a6;
              uVar149 = vcmpps_avx512vl(auVar104,auVar110,4);
              if ((local_3f0 & (byte)uVar149) == 0) {
                local_3f0 = 0;
              }
              else {
                local_3f0 = local_3f0 & (byte)uVar149;
                fVar179 = auVar102._0_4_ * fVar168;
                fVar162 = auVar102._4_4_ * fVar147;
                auVar68._4_4_ = fVar162;
                auVar68._0_4_ = fVar179;
                fVar167 = auVar102._8_4_ * fVar177;
                auVar68._8_4_ = fVar167;
                fVar91 = auVar102._12_4_ * fVar178;
                auVar68._12_4_ = fVar91;
                fVar161 = auVar102._16_4_ * 0.0;
                auVar68._16_4_ = fVar161;
                fVar139 = auVar102._20_4_ * 0.0;
                auVar68._20_4_ = fVar139;
                fVar140 = auVar102._24_4_ * 0.0;
                auVar68._24_4_ = fVar140;
                auVar68._28_4_ = auVar102._28_4_;
                fVar168 = auVar108._0_4_ * fVar168;
                fVar147 = auVar108._4_4_ * fVar147;
                auVar69._4_4_ = fVar147;
                auVar69._0_4_ = fVar168;
                fVar177 = auVar108._8_4_ * fVar177;
                auVar69._8_4_ = fVar177;
                fVar178 = auVar108._12_4_ * fVar178;
                auVar69._12_4_ = fVar178;
                fVar141 = auVar108._16_4_ * 0.0;
                auVar69._16_4_ = fVar141;
                fVar142 = auVar108._20_4_ * 0.0;
                auVar69._20_4_ = fVar142;
                fVar143 = auVar108._24_4_ * 0.0;
                auVar69._24_4_ = fVar143;
                auVar69._28_4_ = auVar108._28_4_;
                auVar184._8_4_ = 0x3f800000;
                auVar184._0_8_ = &DAT_3f8000003f800000;
                auVar184._12_4_ = 0x3f800000;
                auVar184._16_4_ = 0x3f800000;
                auVar184._20_4_ = 0x3f800000;
                auVar184._24_4_ = 0x3f800000;
                auVar184._28_4_ = 0x3f800000;
                auVar104 = vsubps_avx512vl(auVar184,auVar68);
                bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar83 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar83 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
                bVar18 = SUB81(uVar83 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar18 * auVar102._28_4_ |
                                              (uint)!bVar18 * auVar104._28_4_,
                                              CONCAT424((uint)bVar17 * (int)fVar140 |
                                                        (uint)!bVar17 * auVar104._24_4_,
                                                        CONCAT420((uint)bVar16 * (int)fVar139 |
                                                                  (uint)!bVar16 * auVar104._20_4_,
                                                                  CONCAT416((uint)bVar15 *
                                                                            (int)fVar161 |
                                                                            (uint)!bVar15 *
                                                                            auVar104._16_4_,
                                                                            CONCAT412((uint)bVar14 *
                                                                                      (int)fVar91 |
                                                                                      (uint)!bVar14
                                                                                      * auVar104.
                                                  _12_4_,CONCAT48((uint)bVar13 * (int)fVar167 |
                                                                  (uint)!bVar13 * auVar104._8_4_,
                                                                  CONCAT44((uint)bVar12 *
                                                                           (int)fVar162 |
                                                                           (uint)!bVar12 *
                                                                           auVar104._4_4_,
                                                                           (uint)(bVar86 & 1) *
                                                                           (int)fVar179 |
                                                                           (uint)!(bool)(bVar86 & 1)
                                                                           * auVar104._0_4_))))))));
                auVar104 = vsubps_avx(auVar184,auVar69);
                bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar83 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar83 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
                bVar18 = SUB81(uVar83 >> 7,0);
                local_360._4_4_ = (uint)bVar12 * (int)fVar147 | (uint)!bVar12 * auVar104._4_4_;
                local_360._0_4_ =
                     (uint)(bVar86 & 1) * (int)fVar168 | (uint)!(bool)(bVar86 & 1) * auVar104._0_4_;
                local_360._8_4_ = (uint)bVar13 * (int)fVar177 | (uint)!bVar13 * auVar104._8_4_;
                local_360._12_4_ = (uint)bVar14 * (int)fVar178 | (uint)!bVar14 * auVar104._12_4_;
                local_360._16_4_ = (uint)bVar15 * (int)fVar141 | (uint)!bVar15 * auVar104._16_4_;
                local_360._20_4_ = (uint)bVar16 * (int)fVar142 | (uint)!bVar16 * auVar104._20_4_;
                local_360._24_4_ = (uint)bVar17 * (int)fVar143 | (uint)!bVar17 * auVar104._24_4_;
                local_360._28_4_ = (uint)bVar18 * auVar108._28_4_ | (uint)!bVar18 * auVar104._28_4_;
                in_ZMM21 = ZEXT3264(auVar115);
              }
            }
            auVar201 = ZEXT3264(local_700);
            if (local_3f0 == 0) goto LAB_01d59965;
            auVar104 = vsubps_avx(ZEXT1632(auVar94),auVar99);
            local_600 = in_ZMM20._0_32_;
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_600,auVar99);
            auVar155._0_4_ = auVar104._0_4_ + auVar104._0_4_;
            auVar155._4_4_ = auVar104._4_4_ + auVar104._4_4_;
            auVar155._8_4_ = auVar104._8_4_ + auVar104._8_4_;
            auVar155._12_4_ = auVar104._12_4_ + auVar104._12_4_;
            auVar155._16_4_ = auVar104._16_4_ + auVar104._16_4_;
            auVar155._20_4_ = auVar104._20_4_ + auVar104._20_4_;
            auVar155._24_4_ = auVar104._24_4_ + auVar104._24_4_;
            auVar155._28_4_ = auVar104._28_4_ + auVar104._28_4_;
            uVar148 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar30._4_4_ = uVar148;
            auVar30._0_4_ = uVar148;
            auVar30._8_4_ = uVar148;
            auVar30._12_4_ = uVar148;
            auVar30._16_4_ = uVar148;
            auVar30._20_4_ = uVar148;
            auVar30._24_4_ = uVar148;
            auVar30._28_4_ = uVar148;
            auVar104 = vmulps_avx512vl(auVar155,auVar30);
            local_620 = in_ZMM21._0_32_;
            uVar149 = vcmpps_avx512vl(local_620,auVar104,6);
            local_3f0 = local_3f0 & (byte)uVar149;
            if (local_3f0 == 0) goto LAB_01d59965;
            auVar156._8_4_ = 0xbf800000;
            auVar156._0_8_ = 0xbf800000bf800000;
            auVar156._12_4_ = 0xbf800000;
            auVar156._16_4_ = 0xbf800000;
            auVar156._20_4_ = 0xbf800000;
            auVar156._24_4_ = 0xbf800000;
            auVar156._28_4_ = 0xbf800000;
            auVar31._8_4_ = 0x40000000;
            auVar31._0_8_ = 0x4000000040000000;
            auVar31._12_4_ = 0x40000000;
            auVar31._16_4_ = 0x40000000;
            auVar31._20_4_ = 0x40000000;
            auVar31._24_4_ = 0x40000000;
            auVar31._28_4_ = 0x40000000;
            local_480 = vfmadd132ps_avx512vl(local_360,auVar156,auVar31);
            local_360 = local_480;
            auVar104 = local_360;
            local_440 = (undefined4)lVar87;
            local_420 = local_550._0_8_;
            uStack_418 = local_550._8_8_;
            local_410 = local_560._0_8_;
            uStack_408 = local_560._8_8_;
            local_400 = local_570._0_8_;
            uStack_3f8 = local_570._8_8_;
            pGVar10 = (context->scene->geometries).items[uVar88].ptr;
            local_780 = (undefined1  [8])pGVar10;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              bVar86 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar86 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar115 = vaddps_avx512vl(local_600,_DAT_02020f40);
              auVar95 = vcvtsi2ss_avx512f(auVar202._0_16_,local_440);
              fVar168 = auVar95._0_4_;
              local_3e0[0] = (fVar168 + auVar115._0_4_) * local_500;
              local_3e0[1] = (fVar168 + auVar115._4_4_) * fStack_4fc;
              local_3e0[2] = (fVar168 + auVar115._8_4_) * fStack_4f8;
              local_3e0[3] = (fVar168 + auVar115._12_4_) * fStack_4f4;
              fStack_3d0 = (fVar168 + auVar115._16_4_) * fStack_4f0;
              fStack_3cc = (fVar168 + auVar115._20_4_) * fStack_4ec;
              fStack_3c8 = (fVar168 + auVar115._24_4_) * fStack_4e8;
              fStack_3c4 = fVar168 + auVar115._28_4_;
              local_360._0_8_ = local_480._0_8_;
              local_360._8_8_ = local_480._8_8_;
              local_360._16_8_ = local_480._16_8_;
              local_360._24_8_ = local_480._24_8_;
              local_3c0 = local_360._0_8_;
              uStack_3b8 = local_360._8_8_;
              uStack_3b0 = local_360._16_8_;
              uStack_3a8 = local_360._24_8_;
              local_3a0 = local_620;
              local_6c0 = local_550._0_4_;
              fStack_6bc = local_550._4_4_;
              fStack_6b8 = local_550._8_4_;
              fStack_6b4 = local_550._12_4_;
              uVar83 = 0;
              local_730 = (ulong)local_3f0;
              for (uVar85 = local_730; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000)
              {
                uVar83 = uVar83 + 1;
              }
              local_750 = local_560;
              local_2f0 = local_570._0_8_;
              uStack_2e8 = local_570._8_8_;
              uVar85 = 0x222bb01;
              local_6a8 = lVar87;
              local_4a0 = local_600;
              local_460 = local_620;
              local_43c = iVar9;
              local_430 = auVar19;
              local_360 = auVar104;
              do {
                local_740 = *(undefined4 *)(ray + k * 4 + 0x100);
                fVar168 = local_3e0[uVar83];
                auVar158._4_4_ = fVar168;
                auVar158._0_4_ = fVar168;
                auVar158._8_4_ = fVar168;
                auVar158._12_4_ = fVar168;
                local_260._16_4_ = fVar168;
                local_260._0_16_ = auVar158;
                local_260._20_4_ = fVar168;
                local_260._24_4_ = fVar168;
                local_260._28_4_ = fVar168;
                local_240 = *(undefined4 *)((long)&local_3c0 + uVar83 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3a0 + uVar83 * 4);
                local_7b0.context = context->user;
                fVar147 = 1.0 - fVar168;
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar92 = vxorps_avx512vl(ZEXT416((uint)fVar147),auVar22);
                auVar95 = ZEXT416((uint)(fVar168 * fVar147 * 4.0));
                auVar94 = vfnmsub213ss_fma(auVar158,auVar158,auVar95);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),auVar95);
                fVar147 = fVar147 * auVar92._0_4_ * 0.5;
                fVar177 = auVar94._0_4_ * 0.5;
                fVar178 = auVar95._0_4_ * 0.5;
                fVar168 = fVar168 * fVar168 * 0.5;
                auVar181._0_4_ = fVar168 * (float)local_2f0;
                auVar181._4_4_ = fVar168 * local_2f0._4_4_;
                auVar181._8_4_ = fVar168 * (float)uStack_2e8;
                auVar181._12_4_ = fVar168 * uStack_2e8._4_4_;
                auVar152._4_4_ = fVar178;
                auVar152._0_4_ = fVar178;
                auVar152._8_4_ = fVar178;
                auVar152._12_4_ = fVar178;
                auVar95 = vfmadd132ps_fma(auVar152,auVar181,local_750);
                auVar170._4_4_ = fVar177;
                auVar170._0_4_ = fVar177;
                auVar170._8_4_ = fVar177;
                auVar170._12_4_ = fVar177;
                auVar78._4_4_ = fStack_6bc;
                auVar78._0_4_ = local_6c0;
                auVar78._8_4_ = fStack_6b8;
                auVar78._12_4_ = fStack_6b4;
                auVar95 = vfmadd132ps_fma(auVar170,auVar95,auVar78);
                auVar153._4_4_ = fVar147;
                auVar153._0_4_ = fVar147;
                auVar153._8_4_ = fVar147;
                auVar153._12_4_ = fVar147;
                auVar95 = vfmadd213ps_fma(auVar153,auVar19,auVar95);
                local_2c0 = auVar95._0_4_;
                auVar176._8_4_ = 1;
                auVar176._0_8_ = 0x100000001;
                auVar176._12_4_ = 1;
                auVar176._16_4_ = 1;
                auVar176._20_4_ = 1;
                auVar176._24_4_ = 1;
                auVar176._28_4_ = 1;
                local_2a0 = vpermps_avx2(auVar176,ZEXT1632(auVar95));
                auVar185._8_4_ = 2;
                auVar185._0_8_ = 0x200000002;
                auVar185._12_4_ = 2;
                auVar185._16_4_ = 2;
                auVar185._20_4_ = 2;
                auVar185._24_4_ = 2;
                auVar185._28_4_ = 2;
                local_280 = vpermps_avx2(auVar185,ZEXT1632(auVar95));
                uStack_2bc = local_2c0;
                uStack_2b8 = local_2c0;
                uStack_2b4 = local_2c0;
                uStack_2b0 = local_2c0;
                uStack_2ac = local_2c0;
                uStack_2a8 = local_2c0;
                uStack_2a4 = local_2c0;
                uStack_23c = local_240;
                uStack_238 = local_240;
                uStack_234 = local_240;
                uStack_230 = local_240;
                uStack_22c = local_240;
                uStack_228 = local_240;
                uStack_224 = local_240;
                local_220 = local_380._0_8_;
                uStack_218 = local_380._8_8_;
                uStack_210 = local_380._16_8_;
                uStack_208 = local_380._24_8_;
                local_200 = local_4c0;
                vpcmpeqd_avx2(local_4c0,local_4c0);
                local_1e0 = (local_7b0.context)->instID[0];
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                local_1c0 = (local_7b0.context)->instPrimID[0];
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                local_6e0 = local_2e0._0_8_;
                uStack_6d8 = local_2e0._8_8_;
                uStack_6d0 = local_2e0._16_8_;
                uStack_6c8 = local_2e0._24_8_;
                local_7b0.valid = (int *)&local_6e0;
                local_7b0.geometryUserPtr = *(void **)((long)local_780 + 0x18);
                local_7b0.hit = (RTCHitN *)&local_2c0;
                local_7b0.N = 8;
                local_520._0_4_ = (int)uVar85;
                local_540._0_8_ = uVar83;
                uVar84 = uVar83;
                local_7b0.ray = (RTCRayN *)ray;
                if (*(code **)((long)local_780 + 0x48) != (code *)0x0) {
                  (**(code **)((long)local_780 + 0x48))(&local_7b0);
                  uVar85 = (ulong)(uint)local_520._0_4_;
                  uVar84 = local_540._0_8_;
                }
                auVar76._8_8_ = uStack_6d8;
                auVar76._0_8_ = local_6e0;
                auVar76._16_8_ = uStack_6d0;
                auVar76._24_8_ = uStack_6c8;
                if (auVar76 != (undefined1  [32])0x0) {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)((long)local_780 + 0x3e) & 0x40) != 0)))) {
                    (*p_Var11)(&local_7b0);
                    uVar85 = (ulong)(uint)local_520._0_4_;
                    uVar84 = local_540._0_8_;
                  }
                  auVar95 = auVar205._0_16_;
                  auVar77._8_8_ = uStack_6d8;
                  auVar77._0_8_ = local_6e0;
                  auVar77._16_8_ = uStack_6d0;
                  auVar77._24_8_ = uStack_6c8;
                  uVar83 = vptestmd_avx512vl(auVar77,auVar77);
                  auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar12 = (bool)((byte)uVar83 & 1);
                  auVar138._0_4_ =
                       (uint)bVar12 * auVar104._0_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x100);
                  bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
                  auVar138._4_4_ =
                       (uint)bVar12 * auVar104._4_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x104);
                  bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
                  auVar138._8_4_ =
                       (uint)bVar12 * auVar104._8_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x108);
                  bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
                  auVar138._12_4_ =
                       (uint)bVar12 * auVar104._12_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x10c);
                  bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
                  auVar138._16_4_ =
                       (uint)bVar12 * auVar104._16_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x110);
                  bVar12 = (bool)((byte)(uVar83 >> 5) & 1);
                  auVar138._20_4_ =
                       (uint)bVar12 * auVar104._20_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x114);
                  bVar12 = (bool)((byte)(uVar83 >> 6) & 1);
                  auVar138._24_4_ =
                       (uint)bVar12 * auVar104._24_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x118);
                  bVar12 = SUB81(uVar83 >> 7,0);
                  auVar138._28_4_ =
                       (uint)bVar12 * auVar104._28_4_ |
                       (uint)!bVar12 * *(int *)(local_7b0.ray + 0x11c);
                  *(undefined1 (*) [32])(local_7b0.ray + 0x100) = auVar138;
                  if (auVar77 != (undefined1  [32])0x0) break;
                }
                auVar95 = auVar205._0_16_;
                *(undefined4 *)(ray + k * 4 + 0x100) = local_740;
                uVar83 = 0;
                local_730 = local_730 ^ 1L << (uVar84 & 0x3f);
                for (uVar84 = local_730; (uVar84 & 1) == 0;
                    uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                  uVar83 = uVar83 + 1;
                }
                uVar85 = CONCAT71((int7)(uVar85 >> 8),local_730 != 0);
              } while (local_730 != 0);
              bVar86 = (byte)uVar85 & 1;
              auVar95 = vxorps_avx512vl(auVar95,auVar95);
              auVar205 = ZEXT1664(auVar95);
              in_ZMM20 = ZEXT3264(local_600);
              in_ZMM21 = ZEXT3264(local_620);
              auVar203 = ZEXT3264(local_5a0);
              auVar197 = ZEXT3264(local_5c0);
              auVar201 = ZEXT3264(local_700);
              auVar206 = ZEXT3264(local_660);
              auVar207 = ZEXT3264(local_680);
              lVar87 = local_6a8;
            }
            uVar82 = CONCAT31(local_720._1_3_,local_720[0] | bVar86);
          }
          auVar187 = ZEXT3264(auVar103);
          auVar160 = ZEXT3264(auVar105);
          uVar83 = (ulong)uVar82;
          lVar87 = lVar87 + 8;
          auVar202 = auVar197;
        } while ((int)lVar87 < iVar9);
      }
      if ((uVar83 & 1) != 0) {
        return bVar90;
      }
      uVar148 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar27._4_4_ = uVar148;
      auVar27._0_4_ = uVar148;
      auVar27._8_4_ = uVar148;
      auVar27._12_4_ = uVar148;
      auVar27._16_4_ = uVar148;
      auVar27._20_4_ = uVar148;
      auVar27._24_4_ = uVar148;
      auVar27._28_4_ = uVar148;
      uVar149 = vcmpps_avx512vl(local_80,auVar27,2);
      uVar88 = (uint)uVar89 & (uint)uVar149;
      uVar89 = (ulong)uVar88;
      bVar90 = uVar88 != 0;
    } while (bVar90);
  }
  return bVar90;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }